

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O1

void verify_high_num_keeping_headers_param_test(void)

{
  undefined1 auVar1 [16];
  fdb_status s;
  fdb_status fVar2;
  fdb_status extraout_EAX;
  sb_decision_t sVar3;
  int iVar4;
  fdb_status fVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_kvs_handle *pfVar9;
  fdb_kvs_handle *pfVar10;
  fdb_kvs_handle *pfVar11;
  char cVar12;
  char *pcVar13;
  char *pcVar14;
  fdb_config *pfVar15;
  char *pcVar16;
  fdb_doc **doc;
  uint uVar17;
  uint uVar18;
  size_t unaff_RBP;
  ulong uVar19;
  size_t sVar20;
  fdb_kvs_handle *pfVar21;
  fdb_kvs_handle **ptr_handle;
  fdb_kvs_handle *unaff_R12;
  uint uVar22;
  ulong unaff_R13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle;
  char *unaff_R14;
  fdb_config *pfVar23;
  char *pcVar24;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar25;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar26;
  char *unaff_R15;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  void *rvalue;
  char keybuf [16];
  size_t rvalue_len;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  fdb_kvs_handle *pfStackY_2980;
  fdb_file_handle *pfStackY_2978;
  fdb_kvs_config fStackY_2970;
  char acStackY_2958 [264];
  fdb_config fStackY_2850;
  char acStackY_2758 [520];
  fdb_doc **ppfStackY_2550;
  size_t sStackY_2540;
  char *pcStackY_2538;
  char *pcStackY_2530;
  code *pcStackY_2528;
  fdb_kvs_handle *pfStack_2518;
  fdb_file_handle *pfStack_2510;
  fdb_iterator *pfStack_2508;
  fdb_doc *pfStack_2500;
  fdb_kvs_handle *pfStack_24f8;
  timeval tStack_24f0;
  char acStack_24e0 [512];
  fdb_kvs_config fStack_22e0;
  fdb_file_info fStack_22c8;
  char acStack_2280 [256];
  fdb_config fStack_2180;
  char *pcStack_2088;
  fdb_kvs_handle *pfStack_2080;
  fdb_kvs_handle *pfStack_2078;
  fdb_kvs_handle *pfStack_2070;
  fdb_kvs_handle *pfStack_2068;
  fdb_kvs_handle *pfStack_2060;
  fdb_kvs_handle *pfStack_2050;
  fdb_file_handle *pfStack_2048;
  uint uStack_203c;
  fdb_kvs_info fStack_2038;
  timeval tStack_2008;
  fdb_kvs_config fStack_1ff8;
  undefined1 auStack_1fe0 [80];
  docio_handle *pdStack_1f90;
  btreeblk_handle *pbStack_1f88;
  btree_blk_ops *pbStack_1f80;
  filemgr_ops *pfStack_1f78;
  fdb_config fStack_1f70;
  undefined1 uStack_1d99;
  fdb_kvs_handle fStack_1d98;
  fdb_kvs_handle *pfStack_1b90;
  char *pcStack_1b88;
  char *pcStack_1b80;
  fdb_kvs_handle *pfStack_1b78;
  fdb_kvs_handle *pfStack_1b70;
  fdb_file_handle *pfStack_1b68;
  timeval tStack_1b60;
  undefined1 auStack_1b50 [536];
  undefined1 auStack_1938 [375];
  undefined1 uStack_17c1;
  fdb_kvs_handle *pfStack_1738;
  undefined8 uStack_1720;
  fdb_kvs_handle *pfStack_16f8;
  fdb_kvs_handle *pfStack_16f0;
  fdb_kvs_handle *pfStack_16e8;
  fdb_kvs_handle *pfStack_16e0;
  fdb_kvs_handle *pfStack_16d8;
  code *pcStack_16d0;
  fdb_kvs_handle *pfStack_16c8;
  fdb_file_handle *pfStack_16c0;
  fdb_kvs_handle *pfStack_16b8;
  fdb_kvs_handle *pfStack_16b0;
  fdb_kvs_config fStack_16a8;
  timeval tStack_1690;
  fdb_file_info fStack_1680;
  fdb_kvs_info fStack_1638;
  undefined1 auStack_1608 [512];
  fdb_kvs_handle fStack_1408;
  size_t sStack_1200;
  char *pcStack_11f8;
  char *pcStack_11f0;
  code *pcStack_11e8;
  fdb_kvs_handle *pfStack_11e0;
  fdb_file_handle *pfStack_11d8;
  fdb_kvs_info fStack_11d0;
  timeval tStack_11a0;
  fdb_kvs_config fStack_1190;
  fdb_file_info fStack_1178;
  char acStack_1130 [256];
  char acStack_1030 [511];
  undefined1 uStack_e31;
  fdb_config fStack_c30;
  char *pcStack_b38;
  fdb_config *pfStack_b30;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_b28;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_b20;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_b18;
  code *pcStack_b10;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_b08;
  fdb_file_handle *pfStack_b00;
  size_t sStack_af8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_af0;
  kvs_info *pkStack_ae8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ae0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ad8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ad0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ac8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ac0;
  timeval tStack_ab8;
  undefined1 auStack_aa8 [24];
  fdb_file_info fStack_a90;
  fdb_config fStack_a48;
  fdb_config fStack_948;
  fdb_config *pfStack_850;
  fdb_kvs_handle *pfStack_848;
  ulong uStack_840;
  fdb_config *pfStack_838;
  fdb_file_info *pfStack_830;
  code *pcStack_828;
  fdb_kvs_handle *pfStack_820;
  fdb_file_handle *pfStack_818;
  fdb_kvs_handle *pfStack_810;
  fdb_config *pfStack_808;
  size_t sStack_800;
  fdb_kvs_config fStack_7f8;
  timeval tStack_7e0;
  fdb_file_info fStack_7d0;
  fdb_config fStack_788;
  fdb_config *pfStack_690;
  fdb_kvs_handle *pfStack_688;
  fdb_config *pfStack_680;
  fdb_file_info *pfStack_678;
  code *pcStack_670;
  fdb_kvs_handle *pfStack_668;
  fdb_file_handle *pfStack_660;
  fdb_kvs_handle *pfStack_658;
  fdb_kvs_config fStack_650;
  undefined1 auStack_638 [40];
  fdb_file_info fStack_610;
  fdb_config fStack_5c8;
  ulong uStack_4d0;
  fdb_kvs_handle *pfStack_4c8;
  ulong uStack_4c0;
  fdb_config *pfStack_4b8;
  fdb_file_info *pfStack_4b0;
  code *pcStack_4a8;
  fdb_kvs_handle *pfStack_4a0;
  fdb_file_handle *pfStack_498;
  fdb_kvs_handle *pfStack_490;
  fdb_config *pfStack_488;
  size_t sStack_480;
  fdb_kvs_config fStack_478;
  timeval tStack_460;
  undefined1 auStack_450 [280];
  uint8_t auStack_338 [40];
  char acStack_310 [264];
  fdb_kvs_handle *pfStack_208;
  ulong uStack_1f8;
  char *pcStack_1f0;
  fdb_file_info *pfStack_1e8;
  code *pcStack_1e0;
  fdb_kvs_handle *local_1d8;
  fdb_file_handle *local_1d0;
  fdb_kvs_handle *local_1c8;
  void *local_1c0;
  char local_1b8 [24];
  size_t local_1a0;
  fdb_kvs_config local_198;
  timeval local_180;
  fdb_file_info local_170;
  undefined1 local_f9;
  uint32_t local_58;
  undefined4 uStack_54;
  
  pcStack_1e0 = (code *)0x10bd35;
  memleak_start();
  pcStack_1e0 = (code *)0x10bd41;
  gettimeofday(&local_180,(__timezone_ptr_t)0x0);
  pcVar13 = &stack0xfffffffffffffed8;
  pcStack_1e0 = (code *)0x10bd51;
  fdb_get_default_config();
  pcStack_1e0 = (code *)0x10bd5b;
  fdb_get_default_kvs_config();
  pcStack_1e0 = (code *)0x10bd67;
  system("rm -rf  staleblktest* > errorlog.txt");
  local_f9 = 0;
  local_58 = 100;
  uStack_54 = 0;
  pcStack_1e0 = (code *)0x10bd8a;
  fVar2 = fdb_open(&local_1d0,"./staleblktest1",(fdb_config *)pcVar13);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bff9;
  pcStack_1e0 = (code *)0x10bdab;
  fVar2 = fdb_kvs_open(local_1d0,&local_1d8,"num_keep",&local_198);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c000;
  unaff_R13 = 0;
  pcVar13 = "key";
  unaff_R14 = "val";
  unaff_R15 = (char *)&local_170;
  do {
    pcStack_1e0 = (code *)0x10bde3;
    fVar2 = fdb_set_kv(local_1d8,"key",4,"val",4);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010bfe4:
      pcStack_1e0 = (code *)0x10bfeb;
      verify_high_num_keeping_headers_param_test();
      goto LAB_0010bfeb;
    }
    pcStack_1e0 = (code *)0x10bdf8;
    fVar2 = fdb_get_file_info(local_1d0,(fdb_file_info *)unaff_R15);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1e0 = (code *)0x10bfe4;
      verify_high_num_keeping_headers_param_test();
      goto LAB_0010bfe4;
    }
    unaff_R13 = unaff_R13 - 1;
  } while (local_170.file_size < 0x1000001);
  pcStack_1e0 = (code *)0x10be20;
  fVar2 = fdb_commit(local_1d0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c007;
  pcVar13 = "key%d";
  unaff_R14 = local_1b8;
  unaff_R15 = "reu";
  unaff_RBP = 0;
  do {
    pcStack_1e0 = (code *)0x10be4c;
    sprintf(unaff_R14,"key%d",unaff_RBP);
    unaff_R12 = local_1d8;
    pcStack_1e0 = (code *)0x10be58;
    sVar6 = strlen(unaff_R14);
    pcStack_1e0 = (code *)0x10be6f;
    fVar2 = fdb_set_kv(unaff_R12,unaff_R14,sVar6,"reu",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bff2;
    pcStack_1e0 = (code *)0x10be86;
    fVar2 = fdb_commit(local_1d0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bfeb;
    uVar17 = (int)unaff_RBP + 1;
    unaff_RBP = (size_t)uVar17;
  } while (uVar17 != 100);
  pcVar13 = "key";
  unaff_R14 = "val";
  unaff_RBP = unaff_R13 & 0xffffffff;
  do {
    uVar17 = (int)unaff_RBP + 1;
    unaff_RBP = (size_t)uVar17;
    if (uVar17 == 0) goto LAB_0010becf;
    pcStack_1e0 = (code *)0x10bec4;
    fVar2 = fdb_set_kv(local_1d8,"key",4,"val",4);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  pcStack_1e0 = (code *)0x10becf;
  verify_high_num_keeping_headers_param_test();
LAB_0010becf:
  pcStack_1e0 = (code *)0x10bede;
  fVar2 = fdb_commit(local_1d0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c00e;
  pcStack_1e0 = (code *)0x10befa;
  fVar2 = fdb_snapshot_open(local_1d8,&local_1c8,-unaff_R13);
  if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c015;
  pcStack_1e0 = (code *)0x10bf19;
  fVar2 = fdb_snapshot_open(local_1d8,&local_1c8,1 - unaff_R13);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c01a;
  unaff_R14 = local_1b8;
  pcStack_1e0 = (code *)0x10bf32;
  sVar6 = strlen(unaff_R14);
  pcStack_1e0 = (code *)0x10bf4a;
  fVar2 = fdb_get_kv(local_1d8,unaff_R14,sVar6,&local_1c0,&local_1a0);
  pcVar13 = (char *)local_1d8;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c021;
  pcStack_1e0 = (code *)0x10bf5c;
  fVar2 = fdb_free_block(local_1c0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c028;
  pcStack_1e0 = (code *)0x10bf6e;
  fVar2 = fdb_kvs_close(local_1c8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c02f;
  pcStack_1e0 = (code *)0x10bf80;
  fVar2 = fdb_close(local_1d0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c036;
  pcStack_1e0 = (code *)0x10bf8d;
  fVar2 = fdb_shutdown();
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_1e0 = (code *)0x10bf9a;
    memleak_end();
    pcVar13 = "%s PASSED\n";
    if (verify_high_num_keeping_headers_param_test()::__test_pass != '\0') {
      pcVar13 = "%s FAILED\n";
    }
    pcStack_1e0 = (code *)0x10bfcb;
    fprintf(_stderr,pcVar13,"verify high num keeping headers param test");
    return;
  }
  goto LAB_0010c03d;
LAB_0010bfeb:
  pcStack_1e0 = (code *)0x10bff2;
  verify_high_num_keeping_headers_param_test();
LAB_0010bff2:
  pcStack_1e0 = (code *)0x10bff9;
  verify_high_num_keeping_headers_param_test();
LAB_0010bff9:
  pcStack_1e0 = (code *)0x10c000;
  verify_high_num_keeping_headers_param_test();
LAB_0010c000:
  pcStack_1e0 = (code *)0x10c007;
  verify_high_num_keeping_headers_param_test();
LAB_0010c007:
  pcStack_1e0 = (code *)0x10c00e;
  verify_high_num_keeping_headers_param_test();
LAB_0010c00e:
  pcStack_1e0 = (code *)0x10c015;
  verify_high_num_keeping_headers_param_test();
LAB_0010c015:
  pcStack_1e0 = (code *)0x10c01a;
  verify_high_num_keeping_headers_param_test();
LAB_0010c01a:
  pcStack_1e0 = (code *)0x10c021;
  verify_high_num_keeping_headers_param_test();
LAB_0010c021:
  pcStack_1e0 = (code *)0x10c028;
  verify_high_num_keeping_headers_param_test();
LAB_0010c028:
  pcStack_1e0 = (code *)0x10c02f;
  verify_high_num_keeping_headers_param_test();
LAB_0010c02f:
  pcStack_1e0 = (code *)0x10c036;
  verify_high_num_keeping_headers_param_test();
LAB_0010c036:
  pcStack_1e0 = (code *)0x10c03d;
  verify_high_num_keeping_headers_param_test();
  fVar2 = extraout_EAX;
LAB_0010c03d:
  uVar19 = (ulong)(uint)fVar2;
  pcStack_1e0 = snapshot_before_block_reuse_test;
  verify_high_num_keeping_headers_param_test();
  pcStack_4a8 = (code *)0x10c05c;
  pfStack_208 = (fdb_kvs_handle *)pcVar13;
  uStack_1f8 = unaff_R13;
  pcStack_1f0 = unaff_R14;
  pfStack_1e8 = (fdb_file_info *)unaff_R15;
  pcStack_1e0 = (code *)unaff_RBP;
  memleak_start();
  pcStack_4a8 = (code *)0x10c068;
  gettimeofday(&tStack_460,(__timezone_ptr_t)0x0);
  pfVar23 = (fdb_config *)(auStack_450 + 0x48);
  pcStack_4a8 = (code *)0x10c078;
  fdb_get_default_config();
  pcStack_4a8 = (code *)0x10c082;
  fdb_get_default_kvs_config();
  pcStack_4a8 = (code *)0x10c08e;
  system("rm -rf  staleblktest* > errorlog.txt");
  auStack_338[0] = '\x01';
  auStack_338[1] = '\0';
  auStack_338[2] = '\0';
  auStack_338[3] = '\0';
  auStack_338[4] = '\0';
  auStack_338[5] = '\0';
  auStack_338[6] = '\0';
  auStack_338[7] = '\0';
  pcStack_4a8 = (code *)0x10c0ad;
  fVar2 = fdb_open(&pfStack_498,"./staleblktest1",pfVar23);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_4a8 = (code *)0x10c0c7;
    fVar2 = fdb_kvs_open_default(pfStack_498,&pfStack_4a0,&fStack_478);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3bd;
    pcStack_4a8 = (code *)0x10c0f1;
    fVar2 = fdb_set_kv(pfStack_4a0,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3c4;
    pcStack_4a8 = (code *)0x10c108;
    fVar2 = fdb_commit(pfStack_498,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3cb;
    ptr_handle = &pfStack_490;
    cVar12 = (char)(uVar19 & 0xffffffff);
    pfVar21 = pfStack_4a0;
    if (cVar12 == '\0') {
LAB_0010c134:
      pcStack_4a8 = (code *)0x10c13e;
      fVar2 = fdb_snapshot_open(pfVar21,ptr_handle,1);
      pcVar13 = (char *)pfVar23;
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010c146;
      goto LAB_0010c40e;
    }
    pcStack_4a8 = (code *)0x10c129;
    fVar2 = fdb_snapshot_open(pfStack_4a0,ptr_handle,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfVar21 = (fdb_kvs_handle *)(ulong)(uint)fVar2;
      pcStack_4a8 = (code *)0x10c134;
      snapshot_before_block_reuse_test();
      goto LAB_0010c134;
    }
LAB_0010c146:
    unaff_RBP = 0;
    unaff_R12 = (fdb_kvs_handle *)auStack_450;
    do {
      pcStack_4a8 = (code *)0x10c175;
      fVar2 = fdb_set_kv(pfStack_4a0,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3a1;
      pcStack_4a8 = (code *)0x10c18a;
      fVar2 = fdb_get_file_info(pfStack_498,(fdb_file_info *)unaff_R12);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c39a;
      uVar17 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar17;
    } while ((ulong)auStack_450._40_8_ < (fdb_file_handle *)0x1000001);
    unaff_R12 = (fdb_kvs_handle *)0x0;
    pfVar23 = (fdb_config *)0x148599;
    unaff_R15 = "val";
    do {
      unaff_R13 = (ulong)uVar17;
      do {
        pcStack_4a8 = (code *)0x10c1cd;
        fVar2 = fdb_set_kv(pfStack_4a0,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_4a8 = (code *)0x10c39a;
          snapshot_before_block_reuse_test();
          goto LAB_0010c39a;
        }
        uVar22 = (int)unaff_R13 - 1;
        unaff_R13 = (ulong)uVar22;
      } while (uVar22 != 0);
      pcStack_4a8 = (code *)0x10c1e9;
      fVar2 = fdb_commit(pfStack_498,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3a8;
      uVar22 = (int)unaff_R12 + 1;
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar22;
    } while (uVar22 != 5);
    pcStack_4a8 = (code *)0x10c203;
    sVar3 = sb_check_block_reusing(pfStack_4a0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010c3d2;
    pcStack_4a8 = (code *)0x10c22c;
    fVar2 = fdb_get_kv(pfStack_490,"key",4,&pfStack_488,&sStack_480);
    pcVar13 = (char *)pfStack_488;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3d7;
    pcStack_4a8 = (code *)0x10c24d;
    iVar4 = bcmp(pfStack_488,"snp",sStack_480);
    if (iVar4 != 0) goto LAB_0010c3de;
    pcStack_4a8 = (code *)0x10c25f;
    fVar2 = fdb_kvs_close(pfStack_490);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3e6;
    pcVar13 = "key";
    unaff_R15 = "val";
    do {
      pcStack_4a8 = (code *)0x10c28f;
      fVar2 = fdb_set_kv(pfStack_4a0,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3af;
      uVar17 = (int)unaff_RBP - 1;
      unaff_RBP = (size_t)uVar17;
    } while (uVar17 != 0);
    pcStack_4a8 = (code *)0x10c2aa;
    fVar2 = fdb_commit(pfStack_498,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3ed;
    pcStack_4a8 = (code *)0x10c2c5;
    fVar2 = fdb_snapshot_open(pfStack_4a0,&pfStack_490,1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c2df:
      if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c3f4;
      pcStack_4a8 = (code *)0x10c2f2;
      fVar2 = fdb_free_block(pfStack_488);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3f9;
      pcStack_4a8 = (code *)0x10c303;
      fVar2 = fdb_kvs_close(pfStack_4a0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c400;
      pcStack_4a8 = (code *)0x10c315;
      fVar2 = fdb_close(pfStack_498);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_4a8 = (code *)0x10c322;
        fdb_shutdown();
        pcStack_4a8 = (code *)0x10c327;
        memleak_end();
        pcVar13 = "disk snapshot";
        if (cVar12 != '\0') {
          pcVar13 = "in-mem snapshot";
        }
        pcStack_4a8 = (code *)0x10c354;
        sprintf(acStack_310,"snapshot before block reuse test %s",pcVar13);
        pcVar13 = "%s PASSED\n";
        if (snapshot_before_block_reuse_test(bool)::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        pcStack_4a8 = (code *)0x10c381;
        fprintf(_stderr,pcVar13,acStack_310);
        return;
      }
      goto LAB_0010c407;
    }
    pcStack_4a8 = (code *)0x10c2d3;
    fVar5 = fdb_kvs_close(pfStack_490);
    fVar2 = FDB_RESULT_SUCCESS;
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_0010c2df;
  }
  else {
LAB_0010c3b6:
    pcStack_4a8 = (code *)0x10c3bd;
    snapshot_before_block_reuse_test();
LAB_0010c3bd:
    pcStack_4a8 = (code *)0x10c3c4;
    snapshot_before_block_reuse_test();
LAB_0010c3c4:
    pcStack_4a8 = (code *)0x10c3cb;
    snapshot_before_block_reuse_test();
LAB_0010c3cb:
    pcStack_4a8 = (code *)0x10c3d2;
    snapshot_before_block_reuse_test();
LAB_0010c3d2:
    pcStack_4a8 = (code *)0x10c3d7;
    snapshot_before_block_reuse_test();
LAB_0010c3d7:
    pcVar13 = (char *)pfVar23;
    pcStack_4a8 = (code *)0x10c3de;
    snapshot_before_block_reuse_test();
LAB_0010c3de:
    pcStack_4a8 = (code *)0x10c3e6;
    snapshot_before_block_reuse_test();
LAB_0010c3e6:
    pcStack_4a8 = (code *)0x10c3ed;
    snapshot_before_block_reuse_test();
LAB_0010c3ed:
    pcStack_4a8 = (code *)0x10c3f4;
    snapshot_before_block_reuse_test();
LAB_0010c3f4:
    pcStack_4a8 = (code *)0x10c3f9;
    snapshot_before_block_reuse_test();
LAB_0010c3f9:
    pcStack_4a8 = (code *)0x10c400;
    snapshot_before_block_reuse_test();
LAB_0010c400:
    pcStack_4a8 = (code *)0x10c407;
    snapshot_before_block_reuse_test();
LAB_0010c407:
    pcStack_4a8 = (code *)0x10c40e;
    snapshot_before_block_reuse_test();
LAB_0010c40e:
    pcStack_4a8 = (code *)0x10c415;
    snapshot_before_block_reuse_test();
  }
  pcStack_4a8 = snapshot_after_block_reuse_test;
  snapshot_before_block_reuse_test();
  pcStack_670 = (code *)0x10c430;
  uStack_4d0 = uVar19 & 0xffffffff;
  pfStack_4c8 = unaff_R12;
  uStack_4c0 = unaff_R13;
  pfStack_4b8 = (fdb_config *)pcVar13;
  pfStack_4b0 = (fdb_file_info *)unaff_R15;
  pcStack_4a8 = (code *)unaff_RBP;
  memleak_start();
  pcStack_670 = (code *)0x10c43c;
  gettimeofday((timeval *)(auStack_638 + 0x18),(__timezone_ptr_t)0x0);
  pcVar14 = (char *)&fStack_5c8;
  pcStack_670 = (code *)0x10c44c;
  fdb_get_default_config();
  pcStack_670 = (code *)0x10c456;
  fdb_get_default_kvs_config();
  pcStack_670 = (code *)0x10c462;
  system("rm -rf  staleblktest* > errorlog.txt");
  fStack_5c8.compaction_threshold = '\0';
  fStack_5c8.num_keeping_headers = 5;
  pcStack_670 = (code *)0x10c485;
  fVar2 = fdb_open(&pfStack_660,"./staleblktest1",(fdb_config *)pcVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_670 = (code *)0x10c4a6;
    fVar2 = fdb_kvs_open(pfStack_660,&pfStack_668,"num_keep",&fStack_650);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6c3;
    unaff_R13 = 0;
    pcVar14 = "key";
    pcVar13 = "val";
    unaff_R15 = (char *)&fStack_610;
    do {
      pcStack_670 = (code *)0x10c4de;
      fVar2 = fdb_set_kv(pfStack_668,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c6a7:
        pcStack_670 = (code *)0x10c6ae;
        snapshot_after_block_reuse_test();
        goto LAB_0010c6ae;
      }
      pcStack_670 = (code *)0x10c4f3;
      fVar2 = fdb_get_file_info(pfStack_660,(fdb_file_info *)unaff_R15);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_670 = (code *)0x10c6a7;
        snapshot_after_block_reuse_test();
        goto LAB_0010c6a7;
      }
      unaff_R13 = unaff_R13 - 1;
    } while (fStack_610.file_size < 0x1000001);
    pcStack_670 = (code *)0x10c51b;
    fVar2 = fdb_commit(pfStack_660,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6ca;
    pcVar14 = "key%d";
    pcVar13 = auStack_638;
    unaff_R15 = "reu";
    unaff_RBP = 0;
    do {
      pcStack_670 = (code *)0x10c547;
      sprintf(pcVar13,"key%d",unaff_RBP);
      unaff_R12 = pfStack_668;
      pcStack_670 = (code *)0x10c553;
      sVar6 = strlen(pcVar13);
      pcStack_670 = (code *)0x10c56a;
      fVar2 = fdb_set_kv(unaff_R12,pcVar13,sVar6,"reu",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b5;
      pcStack_670 = (code *)0x10c581;
      fVar2 = fdb_commit(pfStack_660,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6ae;
      uVar17 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar17;
    } while (uVar17 != 10);
    pcVar14 = "key";
    pcVar13 = "val";
    unaff_RBP = unaff_R13 & 0xffffffff;
    do {
      uVar17 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar17;
      if (uVar17 == 0) goto LAB_0010c5ca;
      pcStack_670 = (code *)0x10c5bf;
      fVar2 = fdb_set_kv(pfStack_668,"key",4,"val",4);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    pcStack_670 = (code *)0x10c5ca;
    snapshot_after_block_reuse_test();
LAB_0010c5ca:
    pcStack_670 = (code *)0x10c5d9;
    fVar2 = fdb_commit(pfStack_660,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d1;
    pcStack_670 = (code *)0x10c5f7;
    fVar2 = fdb_snapshot_open(pfStack_668,&pfStack_658,6 - unaff_R13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d8;
    pcStack_670 = (code *)0x10c609;
    fVar2 = fdb_kvs_close(pfStack_658);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6df;
    pcStack_670 = (code *)0x10c627;
    fVar2 = fdb_snapshot_open(pfStack_668,&pfStack_658,5 - unaff_R13);
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c6e6;
    pcStack_670 = (code *)0x10c639;
    fVar2 = fdb_kvs_close(pfStack_668);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6eb;
    pcStack_670 = (code *)0x10c64b;
    fVar2 = fdb_close(pfStack_660);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_670 = (code *)0x10c658;
      fdb_shutdown();
      pcStack_670 = (code *)0x10c65d;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (snapshot_after_block_reuse_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pcStack_670 = (code *)0x10c68e;
      fprintf(_stderr,pcVar13,"snapshot after block reuse test");
      return;
    }
  }
  else {
LAB_0010c6bc:
    pcStack_670 = (code *)0x10c6c3;
    snapshot_after_block_reuse_test();
LAB_0010c6c3:
    pcStack_670 = (code *)0x10c6ca;
    snapshot_after_block_reuse_test();
LAB_0010c6ca:
    pcStack_670 = (code *)0x10c6d1;
    snapshot_after_block_reuse_test();
LAB_0010c6d1:
    pcStack_670 = (code *)0x10c6d8;
    snapshot_after_block_reuse_test();
LAB_0010c6d8:
    pcStack_670 = (code *)0x10c6df;
    snapshot_after_block_reuse_test();
LAB_0010c6df:
    pcStack_670 = (code *)0x10c6e6;
    snapshot_after_block_reuse_test();
LAB_0010c6e6:
    pcStack_670 = (code *)0x10c6eb;
    snapshot_after_block_reuse_test();
LAB_0010c6eb:
    pcStack_670 = (code *)0x10c6f2;
    snapshot_after_block_reuse_test();
  }
  pcStack_670 = snapshot_inmem_before_block_reuse_test;
  snapshot_after_block_reuse_test();
  pcStack_828 = (code *)0x10c70d;
  pfStack_690 = (fdb_config *)pcVar14;
  pfStack_688 = unaff_R12;
  pfStack_680 = (fdb_config *)pcVar13;
  pfStack_678 = (fdb_file_info *)unaff_R15;
  pcStack_670 = (code *)unaff_RBP;
  memleak_start();
  pcStack_828 = (code *)0x10c719;
  gettimeofday(&tStack_7e0,(__timezone_ptr_t)0x0);
  pfVar23 = &fStack_788;
  pcStack_828 = (code *)0x10c729;
  fdb_get_default_config();
  pcStack_828 = (code *)0x10c733;
  fdb_get_default_kvs_config();
  pcStack_828 = (code *)0x10c73f;
  system("rm -rf  staleblktest* > errorlog.txt");
  fStack_788.num_keeping_headers = 1;
  pcStack_828 = (code *)0x10c75e;
  fVar2 = fdb_open(&pfStack_818,"./staleblktest1",pfVar23);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_828 = (code *)0x10c778;
    fVar2 = fdb_kvs_open_default(pfStack_818,&pfStack_820,&fStack_7f8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca2a;
    pcStack_828 = (code *)0x10c7a2;
    fVar2 = fdb_set_kv(pfStack_820,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca31;
    pcStack_828 = (code *)0x10c7b9;
    fVar2 = fdb_commit(pfStack_818,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca38;
    pcStack_828 = (code *)0x10c7d6;
    fVar2 = fdb_snapshot_open(pfStack_820,&pfStack_810,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca3f;
    unaff_RBP = 0;
    unaff_R15 = (char *)&fStack_7d0;
    do {
      pcStack_828 = (code *)0x10c80d;
      fVar2 = fdb_set_kv(pfStack_820,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca0e;
      pcStack_828 = (code *)0x10c822;
      fVar2 = fdb_get_file_info(pfStack_818,(fdb_file_info *)unaff_R15);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca07;
      uVar17 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar17;
    } while (fStack_7d0.file_size < 0x1000001);
    unaff_R15 = (char *)0x0;
    pfVar23 = (fdb_config *)0x148599;
    pcVar13 = "val";
    do {
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar17;
      do {
        pcStack_828 = (code *)0x10c865;
        fVar2 = fdb_set_kv(pfStack_820,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_828 = (code *)0x10ca07;
          snapshot_inmem_before_block_reuse_test();
          goto LAB_0010ca07;
        }
        uVar22 = (int)unaff_R12 - 1;
        unaff_R12 = (fdb_kvs_handle *)(ulong)uVar22;
      } while (uVar22 != 0);
      pcStack_828 = (code *)0x10c881;
      fVar2 = fdb_commit(pfStack_818,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca15;
      uVar22 = (int)unaff_R15 + 1;
      unaff_R15 = (char *)(ulong)uVar22;
    } while (uVar22 != 5);
    pcStack_828 = (code *)0x10c89b;
    sVar3 = sb_check_block_reusing(pfStack_820);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010ca46;
    pcStack_828 = (code *)0x10c8c4;
    fVar2 = fdb_get_kv(pfStack_810,"key",4,&pfStack_808,&sStack_800);
    pfVar15 = pfStack_808;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca4b;
    pcStack_828 = (code *)0x10c8e5;
    iVar4 = bcmp(pfStack_808,"snp",sStack_800);
    if (iVar4 != 0) goto LAB_0010ca52;
    pcStack_828 = (code *)0x10c8f7;
    fVar2 = fdb_kvs_close(pfStack_810);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca5a;
    pfVar15 = (fdb_config *)0x148599;
    pcVar13 = "val";
    do {
      pcStack_828 = (code *)0x10c927;
      fVar2 = fdb_set_kv(pfStack_820,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca1c;
      uVar17 = (int)unaff_RBP - 1;
      unaff_RBP = (size_t)uVar17;
    } while (uVar17 != 0);
    pcStack_828 = (code *)0x10c942;
    fVar2 = fdb_commit(pfStack_818,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca61;
    pcStack_828 = (code *)0x10c95d;
    fVar2 = fdb_snapshot_open(pfStack_820,&pfStack_810,1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c977:
      if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010ca68;
      pcStack_828 = (code *)0x10c98a;
      fVar2 = fdb_free_block(pfStack_808);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca6d;
      pcStack_828 = (code *)0x10c99b;
      fVar2 = fdb_kvs_close(pfStack_820);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca74;
      pcStack_828 = (code *)0x10c9ad;
      fVar2 = fdb_close(pfStack_818);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_828 = (code *)0x10c9ba;
        fdb_shutdown();
        pcStack_828 = (code *)0x10c9bf;
        memleak_end();
        pcVar13 = "%s PASSED\n";
        if (snapshot_inmem_before_block_reuse_test()::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        pcStack_828 = (code *)0x10c9f0;
        fprintf(_stderr,pcVar13,"snapshot inmem before block reuse test");
        return;
      }
      goto LAB_0010ca7b;
    }
    pcStack_828 = (code *)0x10c96b;
    fVar5 = fdb_kvs_close(pfStack_810);
    fVar2 = FDB_RESULT_SUCCESS;
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_0010c977;
  }
  else {
LAB_0010ca23:
    pcStack_828 = (code *)0x10ca2a;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca2a:
    pcStack_828 = (code *)0x10ca31;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca31:
    pcStack_828 = (code *)0x10ca38;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca38:
    pcStack_828 = (code *)0x10ca3f;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca3f:
    pcStack_828 = (code *)0x10ca46;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca46:
    pcStack_828 = (code *)0x10ca4b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca4b:
    pfVar15 = pfVar23;
    pcStack_828 = (code *)0x10ca52;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca52:
    pcStack_828 = (code *)0x10ca5a;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca5a:
    pcStack_828 = (code *)0x10ca61;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca61:
    pcStack_828 = (code *)0x10ca68;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca68:
    pcStack_828 = (code *)0x10ca6d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca6d:
    pcStack_828 = (code *)0x10ca74;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca74:
    pcStack_828 = (code *)0x10ca7b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca7b:
    pcStack_828 = (code *)0x10ca82;
    snapshot_inmem_before_block_reuse_test();
  }
  pcStack_828 = variable_value_size_test;
  snapshot_inmem_before_block_reuse_test();
  aVar25.seqtree = (btree *)0x0;
  pcStack_b10 = (code *)0x10caa7;
  pfStack_850 = pfVar15;
  pfStack_848 = unaff_R12;
  uStack_840 = unaff_R13;
  pfStack_838 = (fdb_config *)pcVar13;
  pfStack_830 = (fdb_file_info *)unaff_R15;
  pcStack_828 = (code *)unaff_RBP;
  gettimeofday(&tStack_ab8,(__timezone_ptr_t)0x0);
  pcStack_b10 = (code *)0x10caac;
  memleak_start();
  pcStack_b10 = (code *)0x10cab6;
  pcVar14 = (char *)operator_new__(0x500000);
  pcVar13 = auStack_aa8;
  pcStack_b10 = (code *)0x10cac6;
  fdb_get_default_kvs_config();
  pfVar23 = &fStack_948;
  pcStack_b10 = (code *)0x10cad6;
  fdb_get_default_config();
  fStack_948.compaction_threshold = '\0';
  fStack_948.block_reusing_threshold = 0x41;
  pcStack_b10 = (code *)0x10caf4;
  system("rm -rf  staleblktest* > errorlog.txt");
  handle.seqtree = (btree *)&pfStack_b00;
  pcStack_b10 = (code *)0x10cb0b;
  fdb_open((fdb_file_handle **)handle.seqtree,"./staleblktest1",pfVar23);
  pcStack_b10 = (code *)0x10cb1a;
  fdb_kvs_open_default(pfStack_b00,(fdb_kvs_handle **)&aStack_b08.seqtree,(fdb_kvs_config *)pcVar13)
  ;
  if (fStack_948.num_keeping_headers != 0xffffffffffffffff) {
    pcVar24 = "%d_key";
    pcVar13 = (char *)&fStack_a48;
    aVar25.seqtree = (btree *)0x0;
    iVar4 = 0;
    do {
      sStack_af8 = CONCAT44(sStack_af8._4_4_,iVar4 + 3);
      pfVar23 = (fdb_config *)0x1ff;
      aStack_af0 = aVar25;
      do {
        pcStack_b10 = (code *)0x10cb60;
        sprintf(pcVar13,"%d_key",(ulong)((int)pfVar23 + 1));
        pcStack_b10 = (code *)0x10cb70;
        memset(pcVar14,0x61,(size_t)pfVar23);
        handle = aStack_b08;
        pcVar14[(long)pfVar23] = '\0';
        pcStack_b10 = (code *)0x10cb81;
        sVar6 = strlen(pcVar13);
        unaff_RBP = sVar6 + 1;
        pcStack_b10 = (code *)0x10cb8d;
        sVar6 = strlen(pcVar14);
        pcStack_b10 = (code *)0x10cba2;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pcVar13,unaff_RBP,pcVar14,sVar6 + 1);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d083;
        pfVar23 = (fdb_config *)&pfVar23[2].wal_threshold;
      } while (pfVar23 != (fdb_config *)0x7ff);
      pcStack_b10 = (code *)0x10cbc9;
      fVar2 = fdb_commit(pfStack_b00,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d091;
      aVar25.seqtree = (btree *)&(aStack_af0.seqtree)->vsize;
      iVar4 = (int)sStack_af8;
    } while (aVar25.seqtree < (undefined1 *)(fStack_948.num_keeping_headers + 1));
    aVar25 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(long)(int)sStack_af8;
  }
  pcStack_b10 = (code *)0x10cc05;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_b08.seqtree,
                            (fdb_kvs_handle **)&aStack_ad0.seqtree,(fdb_seqnum_t)aVar25);
  sVar20 = unaff_RBP;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    sVar7 = 0xffffffff;
    pcVar13 = "%d_key";
    pfVar23 = &fStack_a48;
    handle.seqtree = (btree *)0x0;
LAB_0010cc24:
    unaff_RBP = 0x3ff;
    sStack_af8 = sVar7;
    aStack_af0 = handle;
LAB_0010cc33:
    pcStack_b10 = (code *)0x10cc43;
    sprintf((char *)pfVar23,"%d_key",(ulong)((int)unaff_RBP + 1));
    pcStack_b10 = (code *)0x10cc53;
    memset(pcVar14,0x62,unaff_RBP);
    handle = aStack_b08;
    pcVar14[unaff_RBP] = '\0';
    pcStack_b10 = (code *)0x10cc63;
    sVar6 = strlen((char *)pfVar23);
    pcVar24 = (char *)(sVar6 + 1);
    pcStack_b10 = (code *)0x10cc6f;
    sVar6 = strlen(pcVar14);
    pcStack_b10 = (code *)0x10cc84;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pfVar23,(size_t)pcVar24,pcVar14,sVar6 + 1);
    if (fVar2 == FDB_RESULT_SUCCESS) goto code_r0x0010cc8c;
    pcStack_b10 = (code *)0x10d083;
    variable_value_size_test();
LAB_0010d083:
    pcStack_b10 = (code *)0x10d08a;
    variable_value_size_test();
    goto LAB_0010d08a;
  }
LAB_0010d0a6:
  pcStack_b10 = (code *)0x10d0ad;
  variable_value_size_test();
LAB_0010d0ad:
  pcStack_b10 = (code *)0x10d0b2;
  variable_value_size_test();
LAB_0010d0b2:
  pcStack_b10 = (code *)0x10d0b9;
  variable_value_size_test();
LAB_0010d0b9:
  pcStack_b10 = (code *)0x10d0c0;
  variable_value_size_test();
LAB_0010d0c0:
  pcStack_b10 = (code *)0x10d0c7;
  variable_value_size_test();
LAB_0010d0c7:
  pcStack_b10 = (code *)0x10d0ce;
  variable_value_size_test();
LAB_0010d0ce:
  pcStack_b10 = (code *)0x10d0d5;
  variable_value_size_test();
LAB_0010d0d5:
  aVar26 = aVar25;
  pcStack_b10 = (code *)0x10d0dc;
  variable_value_size_test();
LAB_0010d0dc:
  pcStack_b10 = (code *)0x10d0e4;
  variable_value_size_test();
LAB_0010d0e4:
  pcStack_b10 = (code *)0x10d0eb;
  variable_value_size_test();
LAB_0010d0eb:
  pcStack_b10 = (code *)0x10d0f2;
  variable_value_size_test();
LAB_0010d0f2:
  pcStack_b10 = (code *)0x10d0fa;
  variable_value_size_test();
LAB_0010d0fa:
  pcStack_b10 = (code *)0x10d101;
  variable_value_size_test();
LAB_0010d101:
  pcStack_b10 = (code *)0x10d108;
  variable_value_size_test();
LAB_0010d108:
  pcStack_b10 = (code *)0x10d10f;
  variable_value_size_test();
LAB_0010d10f:
  pcStack_b10 = (code *)0x10d116;
  variable_value_size_test();
LAB_0010d116:
  pcStack_b10 = rollback_with_num_keeping_headers;
  variable_value_size_test();
  pcStack_11e8 = (code *)0x10d13a;
  pcStack_b38 = pcVar14;
  pfStack_b30 = pfVar23;
  aStack_b28 = handle;
  aStack_b20 = aVar26;
  aStack_b18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar13;
  pcStack_b10 = (code *)sVar20;
  gettimeofday(&tStack_11a0,(__timezone_ptr_t)0x0);
  pcStack_11e8 = (code *)0x10d13f;
  memleak_start();
  pcStack_11e8 = (code *)0x10d14c;
  fdb_get_default_kvs_config();
  pcStack_11e8 = (code *)0x10d15c;
  fdb_get_default_config();
  fStack_c30.compaction_threshold = '\0';
  fStack_c30.block_reusing_threshold = 0x41;
  fStack_c30.num_keeping_headers = 1;
  pcStack_11e8 = (code *)0x10d183;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_11e8 = (code *)0x10d19a;
  fdb_open(&pfStack_11d8,"./staleblktest1",&fStack_c30);
  pcStack_11e8 = (code *)0x10d1a8;
  fdb_kvs_open_default(pfStack_11d8,&pfStack_11e0,&fStack_1190);
  pcVar16 = "%dkey";
  pcVar14 = acStack_1130;
  pcVar24 = acStack_1030;
  pcVar13 = (char *)0x0;
  do {
    pcStack_11e8 = (code *)0x10d1d0;
    sprintf(pcVar14,"%dkey",pcVar13);
    pcStack_11e8 = (code *)0x10d1e2;
    memset(pcVar24,0x62,0x1ff);
    pfVar21 = pfStack_11e0;
    uStack_e31 = 0;
    pcStack_11e8 = (code *)0x10d1f6;
    sVar8 = strlen(pcVar14);
    pcStack_11e8 = (code *)0x10d201;
    sVar6 = strlen(pcVar24);
    pcStack_11e8 = (code *)0x10d215;
    fVar2 = fdb_set_kv(pfVar21,pcVar14,sVar8,pcVar24,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d465:
      pcStack_11e8 = (code *)0x10d46c;
      rollback_with_num_keeping_headers();
      goto LAB_0010d46c;
    }
    pcStack_11e8 = (code *)0x10d22c;
    fVar2 = fdb_commit(pfStack_11d8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_11e8 = (code *)0x10d465;
      rollback_with_num_keeping_headers();
      goto LAB_0010d465;
    }
    uVar17 = (int)pcVar13 + 1;
    pcVar13 = (char *)(ulong)uVar17;
  } while (uVar17 != 10);
  pcVar24 = (char *)0x0;
  pcVar13 = acStack_1130;
  pcVar14 = acStack_1030;
  pcVar16 = (char *)0x0;
  do {
    pfVar21 = pfStack_11e0;
    builtin_strncpy(acStack_1130,"0key",5);
    builtin_strncpy(acStack_1030,
                    "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                    ,0x80);
    pcStack_11e8 = (code *)0x10d2be;
    sVar8 = strlen(pcVar13);
    pcStack_11e8 = (code *)0x10d2c9;
    sVar6 = strlen(pcVar14);
    pcStack_11e8 = (code *)0x10d2dd;
    fVar2 = fdb_set_kv(pfVar21,pcVar13,sVar8,pcVar14,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d473;
    pcStack_11e8 = (code *)0x10d2f4;
    fVar2 = fdb_get_file_info(pfStack_11d8,&fStack_1178);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d46c;
    uVar17 = (int)pcVar16 + 1;
    pcVar16 = (char *)(ulong)uVar17;
  } while (fStack_1178.file_size < 0x1000000);
  pcStack_11e8 = (code *)0x10d319;
  sVar3 = sb_check_block_reusing(pfStack_11e0);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_11e8 = (code *)0x10d331;
    fVar2 = fdb_commit(pfStack_11d8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d486;
    pcVar14 = acStack_1130;
    pcVar24 = acStack_1030;
    pcVar13 = (char *)0x0;
    do {
      pcStack_11e8 = (code *)0x10d35e;
      sprintf(pcVar14,"%dkey",pcVar13);
      pcStack_11e8 = (code *)0x10d370;
      memset(pcVar24,100,0x1ff);
      pfVar21 = pfStack_11e0;
      uStack_e31 = 0;
      pcStack_11e8 = (code *)0x10d384;
      sVar8 = strlen(pcVar14);
      pcStack_11e8 = (code *)0x10d38f;
      sVar6 = strlen(pcVar24);
      pcStack_11e8 = (code *)0x10d3a3;
      fVar2 = fdb_set_kv(pfVar21,pcVar14,sVar8,pcVar24,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d47a;
      uVar22 = (int)pcVar13 + 1;
      pcVar13 = (char *)(ulong)uVar22;
    } while (uVar17 != uVar22);
    pcStack_11e8 = (code *)0x10d3be;
    fVar2 = fdb_rollback(&pfStack_11e0,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d48d;
    pcStack_11e8 = (code *)0x10d3d4;
    fVar2 = fdb_get_kvs_info(pfStack_11e0,&fStack_11d0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d494;
    if (fStack_11d0.doc_count != 10) {
      pcStack_11e8 = (code *)0x10d3ee;
      rollback_with_num_keeping_headers();
    }
    pcStack_11e8 = (code *)0x10d3f7;
    fVar2 = fdb_kvs_close(pfStack_11e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d49b;
    pcStack_11e8 = (code *)0x10d409;
    fVar2 = fdb_close(pfStack_11d8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_11e8 = (code *)0x10d416;
      fdb_shutdown();
      pcStack_11e8 = (code *)0x10d41b;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (rollback_with_num_keeping_headers()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pcStack_11e8 = (code *)0x10d44c;
      fprintf(_stderr,pcVar13,"rollback with num keeping headers");
      return;
    }
  }
  else {
LAB_0010d481:
    pcStack_11e8 = (code *)0x10d486;
    rollback_with_num_keeping_headers();
LAB_0010d486:
    pcStack_11e8 = (code *)0x10d48d;
    rollback_with_num_keeping_headers();
LAB_0010d48d:
    pcStack_11e8 = (code *)0x10d494;
    rollback_with_num_keeping_headers();
LAB_0010d494:
    pcStack_11e8 = (code *)0x10d49b;
    rollback_with_num_keeping_headers();
LAB_0010d49b:
    pcStack_11e8 = (code *)0x10d4a2;
    rollback_with_num_keeping_headers();
  }
  pcStack_11e8 = crash_and_recover_with_num_keeping_test;
  rollback_with_num_keeping_headers();
  pcStack_16d0 = (code *)0x10d4c6;
  fStack_1408.bub_ctx.space_used = (uint64_t)pcVar16;
  sStack_1200 = sVar8;
  pcStack_11f8 = pcVar14;
  pcStack_11f0 = pcVar24;
  pcStack_11e8 = (code *)pcVar13;
  gettimeofday(&tStack_1690,(__timezone_ptr_t)0x0);
  pcStack_16d0 = (code *)0x10d4cb;
  memleak_start();
  pcStack_16d0 = (code *)0x10d4d8;
  fdb_get_default_kvs_config();
  pcStack_16d0 = (code *)0x10d4e8;
  fdb_get_default_config();
  fStack_1408.config.block_reusing_threshold._7_1_ = 0;
  fStack_1408.max_seqnum = 0x41;
  fStack_1408.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1408.dirty_updates = '\0';
  fStack_1408._466_6_ = 0;
  pcStack_16d0 = (code *)0x10d50f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_16d0 = (code *)0x10d526;
  fdb_open(&pfStack_16c0,"./staleblktest1file.1",(fdb_config *)&fStack_1408.config.encryption_key);
  pcStack_16d0 = (code *)0x10d53b;
  fdb_kvs_open(pfStack_16c0,&pfStack_16c8,"./staleblktest1",&fStack_16a8);
  pcVar14 = "%dkey";
  pfVar21 = &fStack_1408;
  pfVar11 = (fdb_kvs_handle *)auStack_1608;
  pcVar13 = (char *)0x0;
  do {
    pcStack_16d0 = (code *)0x10d563;
    sprintf((char *)pfVar21,"%dkey",pcVar13);
    pcStack_16d0 = (code *)0x10d575;
    memset(pfVar11,0x62,0x1ff);
    pfVar10 = pfStack_16c8;
    auStack_1608[0x1ff] = 0;
    pcStack_16d0 = (code *)0x10d589;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar21);
    pcStack_16d0 = (code *)0x10d594;
    sVar6 = strlen((char *)pfVar11);
    pcStack_16d0 = (code *)0x10d5a8;
    fVar2 = fdb_set_kv(pfVar10,pfVar21,(size_t)pfVar9,pfVar11,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010da08:
      pcStack_16d0 = (code *)0x10da0f;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da0f;
    }
    pcStack_16d0 = (code *)0x10d5bf;
    fVar2 = fdb_commit(pfStack_16c0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_16d0 = (code *)0x10da08;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da08;
    }
    uVar17 = (int)pcVar13 + 1;
    pcVar13 = (char *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pfVar11 = (fdb_kvs_handle *)0x0;
  pcVar14 = (char *)&fStack_1408;
  pcVar13 = auStack_1608;
  pfVar21 = (fdb_kvs_handle *)0x0;
  do {
    pfVar10 = pfStack_16c8;
    fStack_1408.kvs_config._4_1_ = 0;
    fStack_1408.kvs_config.create_if_missing = true;
    fStack_1408.kvs_config._1_3_ = 0x79656b;
    auStack_1608._0_8_ = 0x6363636363636363;
    auStack_1608._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1608._16_8_ = (void *)0x6363636363636363;
    auStack_1608._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1608._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1608._40_7_ = 0x63636363636363;
    auStack_1608[0x2f] = 99;
    auStack_1608._48_7_ = 0x63636363636363;
    auStack_1608[0x37] = 99;
    auStack_1608._56_7_ = 0x63636363636363;
    auStack_1608[0x3f] = 99;
    auStack_1608._64_8_ = (btree *)0x6363636363636363;
    auStack_1608._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1608._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1608._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1608._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1608._104_7_ = 0x63636363636363;
    auStack_1608[0x6f] = 99;
    auStack_1608._112_7_ = 0x63636363636363;
    auStack_1608._119_8_ = 0x6363636363636363;
    auStack_1608[0x7f] = 0;
    pcStack_16d0 = (code *)0x10d652;
    pfVar9 = (fdb_kvs_handle *)strlen(pcVar14);
    pcStack_16d0 = (code *)0x10d65d;
    sVar6 = strlen(pcVar13);
    pcStack_16d0 = (code *)0x10d671;
    fVar2 = fdb_set_kv(pfVar10,pcVar14,(size_t)pfVar9,pcVar13,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da16;
    pcStack_16d0 = (code *)0x10d688;
    fVar2 = fdb_get_file_info(pfStack_16c0,&fStack_1680);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da0f;
    pfVar21 = (fdb_kvs_handle *)(ulong)((int)pfVar21 + 1);
  } while (fStack_1680.file_size < 0x1000000);
  pcStack_16d0 = (code *)0x10d6ab;
  sVar3 = sb_check_block_reusing(pfStack_16c8);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_16d0 = (code *)0x10d6c3;
    fVar2 = fdb_commit(pfStack_16c0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da45;
    pcStack_16d0 = (code *)0x10d6dc;
    fVar2 = fdb_get_kvs_info(pfStack_16c8,&fStack_1638);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da4c;
    pfStack_16b8 = (fdb_kvs_handle *)fStack_1638.last_seqnum;
    pfVar11 = &fStack_1408;
    pfVar10 = (fdb_kvs_handle *)auStack_1608;
    pcVar13 = (char *)0x0;
    do {
      pcStack_16d0 = (code *)0x10d716;
      sprintf((char *)pfVar11,"%dkey",pcVar13);
      pfVar9 = pfStack_16c8;
      auStack_1608._0_8_ = 0x6464646464646464;
      auStack_1608._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
      auStack_1608._16_8_ = (void *)0x6464646464646464;
      auStack_1608._24_8_ = (kvs_info *)0x6464646464646464;
      auStack_1608._32_8_ = (kvs_ops_stat *)0x6464646464646464;
      auStack_1608._40_7_ = 0x64646464646464;
      auStack_1608[0x2f] = 100;
      auStack_1608._48_7_ = 0x64646464646464;
      auStack_1608[0x37] = 100;
      auStack_1608._56_7_ = 0x64646464646464;
      auStack_1608[0x3f] = 0;
      pcStack_16d0 = (code *)0x10d751;
      pcVar14 = (char *)strlen((char *)pfVar11);
      pcStack_16d0 = (code *)0x10d75c;
      sVar6 = strlen((char *)pfVar10);
      pcStack_16d0 = (code *)0x10d770;
      fVar2 = fdb_set_kv(pfVar9,pfVar11,(size_t)pcVar14,pfVar10,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da24;
      pcStack_16d0 = (code *)0x10d787;
      fVar2 = fdb_commit(pfStack_16c0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da1d;
      uVar17 = (int)pcVar13 + 1;
      pcVar13 = (char *)(ulong)uVar17;
    } while (uVar17 != 10);
    pcStack_16d0 = (code *)0x10d7a3;
    fVar2 = fdb_kvs_close(pfStack_16c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da53;
    pcStack_16d0 = (code *)0x10d7b5;
    fVar2 = fdb_close(pfStack_16c0);
    pcVar14 = (char *)pfStack_16b8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da5a;
    pcStack_16d0 = (code *)0x10d7c7;
    fdb_shutdown();
    pcStack_16d0 = (code *)0x10d7e0;
    fVar2 = fdb_open(&pfStack_16c0,"./staleblktest1file.1",
                     (fdb_config *)&fStack_1408.config.encryption_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da61;
    pcStack_16d0 = (code *)0x10d801;
    fdb_kvs_open(pfStack_16c0,&pfStack_16c8,"./staleblktest1",&fStack_16a8);
    pcStack_16d0 = (code *)0x10d810;
    fVar2 = fdb_get_file_info(pfStack_16c0,&fStack_1680);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da68;
    pcStack_16d0 = (code *)0x10d838;
    iVar4 = _disk_dump("./staleblktest1file.1",fStack_1680.file_size,
                       (ulong)(((uint)fStack_1408.config.encryption_key.bytes._0_4_ >> 2) +
                              fStack_1408.config.encryption_key.bytes._0_4_ * 2));
    if (iVar4 < 0) goto LAB_0010da6f;
    pcStack_16d0 = (code *)0x10d851;
    fVar2 = fdb_snapshot_open(pfStack_16c8,&pfStack_16b0,(fdb_seqnum_t)pcVar14);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da74;
    pcStack_16d0 = (code *)0x10d864;
    fVar2 = fdb_rollback(&pfStack_16c8,(fdb_seqnum_t)pcVar14);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da7b;
    pcStack_16d0 = (code *)0x10d87d;
    fVar2 = fdb_compact(pfStack_16c0,"./staleblktest1file.3");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da82;
    pcVar14 = "%dkey";
    pfVar10 = &fStack_1408;
    pcVar13 = (char *)0x0;
    do {
      pcStack_16d0 = (code *)0x10d8a5;
      sprintf((char *)pfVar10,"%dkey",pcVar13);
      pfVar11 = pfStack_16c8;
      pcStack_16d0 = (code *)0x10d8b1;
      sVar6 = strlen((char *)pfVar10);
      pcStack_16d0 = (code *)0x10d8bf;
      fVar2 = fdb_del_kv(pfVar11,pfVar10,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da32;
      pcStack_16d0 = (code *)0x10d8d6;
      fVar2 = fdb_commit(pfStack_16c0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da2b;
      uVar17 = (int)pcVar13 + 1;
      pcVar13 = (char *)(ulong)uVar17;
    } while (uVar17 != 0xb);
    pcStack_16d0 = (code *)0x10d8ee;
    sVar3 = sb_check_block_reusing(pfStack_16c8);
    if (sVar3 != SBD_NONE) goto LAB_0010da89;
    pcVar13 = (char *)0x0;
    pcVar14 = auStack_1608;
    pfVar9 = &fStack_1408;
    do {
      fStack_1408.kvs_config._4_1_ = 0;
      fStack_1408.kvs_config.create_if_missing = true;
      fStack_1408.kvs_config._1_3_ = 0x79656b;
      pcStack_16d0 = (code *)0x10d92d;
      memset(pcVar14,0x65,0x1ff);
      pfVar11 = pfStack_16c8;
      auStack_1608[0x1ff] = 0;
      pcStack_16d0 = (code *)0x10d941;
      pfVar10 = (fdb_kvs_handle *)strlen((char *)pfVar9);
      pcStack_16d0 = (code *)0x10d94c;
      sVar6 = strlen(pcVar14);
      pcStack_16d0 = (code *)0x10d960;
      fVar2 = fdb_set_kv(pfVar11,pfVar9,(size_t)pfVar10,pcVar14,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da39;
      uVar17 = (int)pfVar21 - 1;
      pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
    } while (uVar17 != 0);
    pcStack_16d0 = (code *)0x10d976;
    sVar3 = sb_check_block_reusing(pfStack_16c8);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010da8e;
    pcStack_16d0 = (code *)0x10d989;
    fVar2 = fdb_kvs_close(pfStack_16b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da93;
    pcStack_16d0 = (code *)0x10d99a;
    fVar2 = fdb_kvs_close(pfStack_16c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da9a;
    pcStack_16d0 = (code *)0x10d9ac;
    fVar2 = fdb_close(pfStack_16c0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_16d0 = (code *)0x10d9b9;
      fdb_shutdown();
      pcStack_16d0 = (code *)0x10d9be;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pcStack_16d0 = (code *)0x10d9ef;
      fprintf(_stderr,pcVar13,"crash and recover with num keeping test");
      return;
    }
  }
  else {
LAB_0010da40:
    pcStack_16d0 = (code *)0x10da45;
    crash_and_recover_with_num_keeping_test();
LAB_0010da45:
    pcStack_16d0 = (code *)0x10da4c;
    crash_and_recover_with_num_keeping_test();
LAB_0010da4c:
    pcStack_16d0 = (code *)0x10da53;
    crash_and_recover_with_num_keeping_test();
LAB_0010da53:
    pcStack_16d0 = (code *)0x10da5a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da5a:
    pcStack_16d0 = (code *)0x10da61;
    crash_and_recover_with_num_keeping_test();
LAB_0010da61:
    pcStack_16d0 = (code *)0x10da68;
    crash_and_recover_with_num_keeping_test();
LAB_0010da68:
    pcStack_16d0 = (code *)0x10da6f;
    crash_and_recover_with_num_keeping_test();
LAB_0010da6f:
    pcStack_16d0 = (code *)0x10da74;
    crash_and_recover_with_num_keeping_test();
LAB_0010da74:
    pcStack_16d0 = (code *)0x10da7b;
    crash_and_recover_with_num_keeping_test();
LAB_0010da7b:
    pcStack_16d0 = (code *)0x10da82;
    crash_and_recover_with_num_keeping_test();
LAB_0010da82:
    pcStack_16d0 = (code *)0x10da89;
    crash_and_recover_with_num_keeping_test();
LAB_0010da89:
    pcStack_16d0 = (code *)0x10da8e;
    crash_and_recover_with_num_keeping_test();
LAB_0010da8e:
    pcStack_16d0 = (code *)0x10da93;
    crash_and_recover_with_num_keeping_test();
LAB_0010da93:
    pcStack_16d0 = (code *)0x10da9a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da9a:
    pcStack_16d0 = (code *)0x10daa1;
    crash_and_recover_with_num_keeping_test();
  }
  pcStack_16d0 = reuse_on_delete_test;
  crash_and_recover_with_num_keeping_test();
  pfStack_1b78 = (fdb_kvs_handle *)0x10dac5;
  pfStack_16f8 = (fdb_kvs_handle *)pcVar14;
  pfStack_16f0 = pfVar10;
  pfStack_16e8 = pfVar9;
  pfStack_16e0 = pfVar21;
  pfStack_16d8 = pfVar11;
  pcStack_16d0 = (code *)pcVar13;
  gettimeofday(&tStack_1b60,(__timezone_ptr_t)0x0);
  pfStack_1b78 = (fdb_kvs_handle *)0x10daca;
  memleak_start();
  pfStack_1b78 = (fdb_kvs_handle *)0x10dada;
  fdb_get_default_kvs_config();
  pfStack_1b78 = (fdb_kvs_handle *)0x10daea;
  fdb_get_default_config();
  uStack_17c1 = 0;
  pfStack_1738 = (fdb_kvs_handle *)0x41;
  uStack_1720 = 10;
  pfStack_1b78 = (fdb_kvs_handle *)0x10db11;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_1b78 = (fdb_kvs_handle *)0x10db28;
  fdb_open(&pfStack_1b68,"./staleblktest1",(fdb_config *)(auStack_1938 + 0x148));
  pfStack_1b78 = (fdb_kvs_handle *)0x10db36;
  fdb_kvs_open_default(pfStack_1b68,&pfStack_1b70,(fdb_kvs_config *)(auStack_1b50 + 0x200));
  pcVar24 = "%dkey";
  pcVar14 = auStack_1938 + 0x48;
  pcVar13 = auStack_1b50;
  pfVar21 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1b78 = (fdb_kvs_handle *)0x10db5b;
    sprintf(pcVar14,"%dkey",pfVar21);
    pfStack_1b78 = (fdb_kvs_handle *)0x10db6d;
    memset(pcVar13,0x62,0x1ff);
    pfVar11 = pfStack_1b70;
    auStack_1b50[0x1ff] = 0;
    pfStack_1b78 = (fdb_kvs_handle *)0x10db81;
    pfVar10 = (fdb_kvs_handle *)strlen(pcVar14);
    pfStack_1b78 = (fdb_kvs_handle *)0x10db8c;
    sVar6 = strlen(pcVar13);
    pfStack_1b78 = (fdb_kvs_handle *)0x10dba0;
    fVar2 = fdb_set_kv(pfVar11,pcVar14,(size_t)pfVar10,pcVar13,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010de39:
      pfStack_1b78 = (fdb_kvs_handle *)0x10de40;
      reuse_on_delete_test();
      goto LAB_0010de40;
    }
    pfStack_1b78 = (fdb_kvs_handle *)0x10dbb7;
    fVar2 = fdb_commit(pfStack_1b68,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_1b78 = (fdb_kvs_handle *)0x10de39;
      reuse_on_delete_test();
      goto LAB_0010de39;
    }
    uVar17 = (int)pfVar21 + 1;
    pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pcVar13 = auStack_1938 + 0x48;
  pfVar11 = (fdb_kvs_handle *)auStack_1b50;
  pfVar10 = (fdb_kvs_handle *)auStack_1938;
  pcVar24 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfVar9 = (fdb_kvs_handle *)pcVar24;
    pfStack_1b78 = (fdb_kvs_handle *)0x10dbf0;
    sprintf(pcVar13,"%dkey",pfVar9);
    pfVar21 = pfStack_1b70;
    auStack_1b50._0_8_ = 0x6363636363636363;
    auStack_1b50._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1b50._16_8_ = (void *)0x6363636363636363;
    auStack_1b50._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1b50._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1b50._40_8_ = (fdb_file_handle *)0x6363636363636363;
    auStack_1b50._48_8_ = (hbtrie *)0x6363636363636363;
    auStack_1b50._56_8_ = (btree *)0x6363636363636363;
    auStack_1b50._64_8_ = (btree *)0x6363636363636363;
    auStack_1b50._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1b50._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1b50._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1b50._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1b50._104_7_ = 0x63636363636363;
    auStack_1b50[0x6f] = 99;
    auStack_1b50._112_7_ = 0x63636363636363;
    auStack_1b50._119_8_ = 0x6363636363636363;
    auStack_1b50[0x7f] = 0;
    pfStack_1b78 = (fdb_kvs_handle *)0x10dc39;
    pcVar14 = (char *)strlen(pcVar13);
    pfStack_1b78 = (fdb_kvs_handle *)0x10dc44;
    sVar6 = strlen((char *)pfVar11);
    pfStack_1b78 = (fdb_kvs_handle *)0x10dc58;
    fVar2 = fdb_set_kv(pfVar21,pcVar13,(size_t)pcVar14,pfVar11,sVar6);
    pcVar24 = (char *)pfVar9;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de47;
    pfStack_1b78 = (fdb_kvs_handle *)0x10dc6d;
    fVar2 = fdb_get_file_info(pfStack_1b68,(fdb_file_info *)pfVar10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de40;
    uVar17 = (uint)pfVar9 + 1;
    pcVar24 = (char *)(ulong)uVar17;
  } while ((ulong)auStack_1938._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_1b78 = (fdb_kvs_handle *)0x10dc92;
  sVar3 = sb_check_block_reusing(pfStack_1b70);
  if (sVar3 == SBD_NONE) {
    pfStack_1b78 = (fdb_kvs_handle *)0x10dca9;
    fVar2 = fdb_commit(pfStack_1b68,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de61;
    pcVar14 = "%dkey";
    pcVar13 = auStack_1938 + 0x48;
    pfVar21 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1b78 = (fdb_kvs_handle *)0x10dcd5;
      sprintf(pcVar13,"%dkey",pfVar21);
      pfVar11 = pfStack_1b70;
      pfStack_1b78 = (fdb_kvs_handle *)0x10dce1;
      sVar6 = strlen(pcVar13);
      pfStack_1b78 = (fdb_kvs_handle *)0x10dcef;
      fVar2 = fdb_del_kv(pfVar11,pcVar13,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de4e;
      uVar22 = (int)pfVar21 + 1;
      pfVar21 = (fdb_kvs_handle *)(ulong)uVar22;
    } while (uVar17 != uVar22);
    pfStack_1b78 = (fdb_kvs_handle *)0x10dd06;
    sVar3 = sb_check_block_reusing(pfStack_1b70);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de68;
    if (2 < (uint)pfVar9) {
      pcVar24 = (char *)(ulong)(uVar17 >> 2);
      pcVar13 = auStack_1938 + 0x48;
      pfVar11 = (fdb_kvs_handle *)auStack_1b50;
      pfVar21 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_1b78 = (fdb_kvs_handle *)0x10dd3e;
        sprintf(pcVar13,"%dkey",pfVar21);
        pfVar9 = pfStack_1b70;
        auStack_1b50._0_8_ = 0x6464646464646464;
        auStack_1b50._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
        auStack_1b50._16_8_ = (void *)0x6464646464646464;
        auStack_1b50._24_8_ = (kvs_info *)0x6464646464646464;
        auStack_1b50._32_8_ = (kvs_ops_stat *)0x6464646464646464;
        auStack_1b50._40_8_ = (fdb_file_handle *)0x6464646464646464;
        auStack_1b50._48_8_ = (hbtrie *)0x6464646464646464;
        auStack_1b50._56_8_ = (btree *)0x6464646464646464;
        auStack_1b50._64_8_ = (btree *)0x6464646464646464;
        auStack_1b50._72_8_ = (filemgr *)0x6464646464646464;
        auStack_1b50._80_8_ = (docio_handle *)0x6464646464646464;
        auStack_1b50._88_8_ = (btreeblk_handle *)0x6464646464646464;
        auStack_1b50._96_8_ = (btree_blk_ops *)0x6464646464646464;
        auStack_1b50._104_7_ = 0x64646464646464;
        auStack_1b50[0x6f] = 100;
        auStack_1b50._112_7_ = 0x64646464646464;
        auStack_1b50._119_8_ = 0x6464646464646464;
        auStack_1b50[0x7f] = 0;
        pfStack_1b78 = (fdb_kvs_handle *)0x10dd87;
        pcVar14 = (char *)strlen(pcVar13);
        pfStack_1b78 = (fdb_kvs_handle *)0x10dd92;
        sVar6 = strlen((char *)pfVar11);
        pfStack_1b78 = (fdb_kvs_handle *)0x10dda6;
        fVar2 = fdb_set_kv(pfVar9,pcVar13,(size_t)pcVar14,pfVar11,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de55;
        uVar22 = (int)pfVar21 + 2;
        pfVar21 = (fdb_kvs_handle *)(ulong)uVar22;
      } while (uVar22 < uVar17 >> 2);
    }
    pcVar13 = auStack_1938 + 0x48;
    pfStack_1b78 = (fdb_kvs_handle *)0x10ddc2;
    sVar3 = sb_check_block_reusing(pfStack_1b70);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de6d;
    pfStack_1b78 = (fdb_kvs_handle *)0x10ddd5;
    fVar2 = fdb_close(pfStack_1b68);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de72;
    pfStack_1b78 = (fdb_kvs_handle *)0x10dde2;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1b78 = (fdb_kvs_handle *)0x10ddef;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (reuse_on_delete_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_1b78 = (fdb_kvs_handle *)0x10de20;
      fprintf(_stderr,pcVar13,"reuse on delete test");
      return;
    }
  }
  else {
LAB_0010de5c:
    pfStack_1b78 = (fdb_kvs_handle *)0x10de61;
    reuse_on_delete_test();
LAB_0010de61:
    pfVar9 = pfVar10;
    pfStack_1b78 = (fdb_kvs_handle *)0x10de68;
    reuse_on_delete_test();
LAB_0010de68:
    pfStack_1b78 = (fdb_kvs_handle *)0x10de6d;
    reuse_on_delete_test();
LAB_0010de6d:
    pfStack_1b78 = (fdb_kvs_handle *)0x10de72;
    reuse_on_delete_test();
LAB_0010de72:
    pfStack_1b78 = (fdb_kvs_handle *)0x10de79;
    reuse_on_delete_test();
  }
  pfStack_1b78 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_2060 = (fdb_kvs_handle *)0x10de9d;
  fStack_1d98.bub_ctx.space_used = (uint64_t)pcVar24;
  fStack_1d98.bub_ctx.handle = pfVar11;
  pfStack_1b90 = pfVar9;
  pcStack_1b88 = pcVar14;
  pcStack_1b80 = pcVar13;
  pfStack_1b78 = pfVar21;
  gettimeofday(&tStack_2008,(__timezone_ptr_t)0x0);
  pfStack_2060 = (fdb_kvs_handle *)0x10dea2;
  memleak_start();
  pfStack_2060 = (fdb_kvs_handle *)0x10deaf;
  fdb_get_default_kvs_config();
  pfStack_2060 = (fdb_kvs_handle *)0x10debf;
  fdb_get_default_config();
  fStack_1d98.config.block_reusing_threshold._7_1_ = 0;
  fStack_1d98.max_seqnum = 0x23;
  fStack_1d98.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1d98.dirty_updates = '\0';
  fStack_1d98._466_6_ = 0;
  pfStack_2060 = (fdb_kvs_handle *)0x10dee6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_2060 = (fdb_kvs_handle *)0x10defd;
  fdb_open(&pfStack_2048,"./staleblktest1",(fdb_config *)&fStack_1d98.config.encryption_key);
  pfStack_2060 = (fdb_kvs_handle *)0x10df0d;
  fdb_kvs_open_default(pfStack_2048,&pfStack_2050,&fStack_1ff8);
  pcVar24 = "%dkey";
  pcVar13 = (char *)&fStack_1d98;
  pcVar14 = auStack_1fe0 + 0x48;
  pfVar21 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_2060 = (fdb_kvs_handle *)0x10df35;
    sprintf(pcVar13,"%dkey",pfVar21);
    pfStack_2060 = (fdb_kvs_handle *)0x10df47;
    memset(pcVar14,0x61,0x1ff);
    pfVar10 = pfStack_2050;
    uStack_1d99 = 0;
    pfStack_2060 = (fdb_kvs_handle *)0x10df5c;
    pfVar11 = (fdb_kvs_handle *)strlen(pcVar13);
    pfStack_2060 = (fdb_kvs_handle *)0x10df67;
    sVar6 = strlen(pcVar14);
    pfStack_2060 = (fdb_kvs_handle *)0x10df7b;
    fVar2 = fdb_set_kv(pfVar10,pcVar13,(size_t)pfVar11,pcVar14,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010e2e3:
      pfStack_2060 = (fdb_kvs_handle *)0x10e2ea;
      fragmented_reuse_test();
      goto LAB_0010e2ea;
    }
    pfStack_2060 = (fdb_kvs_handle *)0x10df92;
    fVar2 = fdb_commit(pfStack_2048,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_2060 = (fdb_kvs_handle *)0x10e2e3;
      fragmented_reuse_test();
      goto LAB_0010e2e3;
    }
    uVar17 = (int)pfVar21 + 1;
    pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pcVar14 = (char *)&fStack_1d98;
  pfVar10 = (fdb_kvs_handle *)(auStack_1fe0 + 0x48);
  pfVar11 = (fdb_kvs_handle *)auStack_1fe0;
  pcVar24 = (char *)0x0;
  do {
    uVar17 = (uint)pcVar24;
    pfStack_2060 = (fdb_kvs_handle *)0x10dfcb;
    sprintf(pcVar14,"%dkey",pcVar24);
    pfVar21 = pfStack_2050;
    auStack_1fe0._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_1f90 = (docio_handle *)0x6262626262626262;
    pbStack_1f88 = (btreeblk_handle *)0x6262626262626262;
    pbStack_1f80 = (btree_blk_ops *)0x6262626262626262;
    pfStack_1f78 = (filemgr_ops *)0x6262626262626262;
    fStack_1f70.chunksize = 0x6262;
    fStack_1f70._2_2_ = 0x6262;
    fStack_1f70.blocksize = 0x62626262;
    fStack_1f70.buffercache_size = 0x6262626262626262;
    fStack_1f70.wal_threshold = 0x6262626262626262;
    fStack_1f70.wal_flush_before_commit = true;
    fStack_1f70.auto_commit = true;
    fStack_1f70._26_2_ = 0x6262;
    fStack_1f70.purging_interval = 0x62626262;
    fStack_1f70.seqtree_opt = 'b';
    fStack_1f70.durability_opt = 'b';
    fStack_1f70._34_2_ = 0x6262;
    fStack_1f70.flags = 0x62626262;
    fStack_1f70.compaction_buf_maxsize = 0x62626262;
    fStack_1f70.cleanup_cache_onclose = true;
    fStack_1f70.compress_document_body = true;
    fStack_1f70.compaction_mode = 'b';
    fStack_1f70.compaction_threshold = 'b';
    fStack_1f70.compaction_minimum_filesize = 0x6262626262626262;
    fStack_1f70.compactor_sleep_duration = 0x6262626262626262;
    fStack_1f70.multi_kv_instances = true;
    fStack_1f70._65_6_ = 0x626262626262;
    fStack_1f70._71_1_ = 0x62;
    fStack_1f70.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_1f70._79_8_ = 0x6262626262626262;
    fStack_1f70._87_1_ = 0;
    pfStack_2060 = (fdb_kvs_handle *)0x10e027;
    pcVar13 = (char *)strlen(pcVar14);
    pfStack_2060 = (fdb_kvs_handle *)0x10e032;
    sVar6 = strlen((char *)pfVar10);
    pfStack_2060 = (fdb_kvs_handle *)0x10e046;
    fVar2 = fdb_set_kv(pfVar21,pcVar14,(size_t)pcVar13,pfVar10,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f1;
    pfStack_2060 = (fdb_kvs_handle *)0x10e05b;
    fVar2 = fdb_get_file_info(pfStack_2048,(fdb_file_info *)pfVar11);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ea;
    uVar22 = uVar17 + 1;
    pcVar24 = (char *)(ulong)uVar22;
  } while ((ulong)auStack_1fe0._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_203c = uVar17;
  if (2 < uVar17) {
    uVar17 = (uVar22 >> 2) + (uint)(uVar22 >> 2 == 0);
    pfVar11 = (fdb_kvs_handle *)(ulong)uVar17;
    pcVar13 = "%dkey";
    pcVar14 = (char *)&fStack_1d98;
    pfVar21 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_2060 = (fdb_kvs_handle *)0x10e0b2;
      sprintf(pcVar14,"%dkey",pfVar21);
      pfVar10 = pfStack_2050;
      pfStack_2060 = (fdb_kvs_handle *)0x10e0bf;
      sVar6 = strlen(pcVar14);
      pfStack_2060 = (fdb_kvs_handle *)0x10e0cd;
      fVar2 = fdb_del_kv(pfVar10,pcVar14,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ff;
      uVar18 = (int)pfVar21 + 1;
      pfVar21 = (fdb_kvs_handle *)(ulong)uVar18;
    } while (uVar17 != uVar18);
  }
  pcVar14 = (char *)&fStack_1d98;
  pfStack_2060 = (fdb_kvs_handle *)0x10e0e6;
  sVar3 = sb_check_block_reusing(pfStack_2050);
  if (sVar3 == SBD_NONE) {
    pcVar14 = (char *)(pfStack_2050->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_2060 = (fdb_kvs_handle *)0x10e10c;
    fVar2 = fdb_compact(pfStack_2048,"staleblktest_compact");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e319;
    pfStack_2060 = (fdb_kvs_handle *)0x10e123;
    fVar2 = fdb_get_kvs_info(pfStack_2050,&fStack_2038);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e320;
    if (fStack_2038.doc_count == 0) {
      pfStack_2060 = (fdb_kvs_handle *)0x10e13d;
      fragmented_reuse_test();
    }
    pcVar13 = (char *)(ulong)(uVar22 >> 2);
    if (pcVar14 <=
        (fdb_kvs_handle *)(pfStack_2050->file->pos).super___atomic_base<unsigned_long>._M_i) {
      pfStack_2060 = (fdb_kvs_handle *)0x10e163;
      fragmented_reuse_test();
    }
    uVar17 = uVar22 >> 1;
    pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
    if (uVar22 >> 2 < uVar17) {
      pcVar14 = "%dkey";
      pfVar10 = &fStack_1d98;
      do {
        pfStack_2060 = (fdb_kvs_handle *)0x10e18b;
        sprintf((char *)pfVar10,"%dkey",pcVar13);
        pfVar11 = pfStack_2050;
        pfStack_2060 = (fdb_kvs_handle *)0x10e198;
        sVar6 = strlen((char *)pfVar10);
        pfStack_2060 = (fdb_kvs_handle *)0x10e1a6;
        fVar2 = fdb_del_kv(pfVar11,pfVar10,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e306;
        uVar18 = (int)pcVar13 + 1;
        pcVar13 = (char *)(ulong)uVar18;
      } while (uVar18 < uVar17);
    }
    pfStack_2060 = (fdb_kvs_handle *)0x10e1c0;
    sVar3 = sb_check_block_reusing(pfStack_2050);
    if (sVar3 != SBD_NONE) goto LAB_0010e327;
    if (uVar17 <= uStack_203c) {
      pcVar13 = "%dkey";
      pcVar14 = (char *)&fStack_1d98;
      do {
        pfStack_2060 = (fdb_kvs_handle *)0x10e1ec;
        sprintf(pcVar14,"%dkey",pfVar21);
        pfVar10 = pfStack_2050;
        pfStack_2060 = (fdb_kvs_handle *)0x10e1f9;
        sVar6 = strlen(pcVar14);
        pfStack_2060 = (fdb_kvs_handle *)0x10e207;
        fVar2 = fdb_del_kv(pfVar10,pcVar14,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e30d;
        uVar17 = (int)pfVar21 + 1;
        pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
      } while (uVar22 != uVar17);
    }
    pcVar24 = (char *)0xb;
    do {
      pfStack_2060 = (fdb_kvs_handle *)0x10e229;
      fVar2 = fdb_commit(pfStack_2048,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f8;
      uVar17 = (int)pcVar24 - 1;
      pcVar24 = (char *)(ulong)uVar17;
    } while (uVar17 != 0);
    pfStack_2060 = (fdb_kvs_handle *)0x10e244;
    fVar2 = fdb_get_kvs_info(pfStack_2050,&fStack_2038);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e32c;
    pfStack_2060 = (fdb_kvs_handle *)0x10e256;
    sVar3 = sb_check_block_reusing(pfStack_2050);
    if (sVar3 == SBD_NONE) goto LAB_0010e333;
    pfStack_2060 = (fdb_kvs_handle *)0x10e26d;
    fVar2 = fdb_commit(pfStack_2048,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e338;
    pfStack_2060 = (fdb_kvs_handle *)0x10e27f;
    fVar2 = fdb_close(pfStack_2048);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e33f;
    pfStack_2060 = (fdb_kvs_handle *)0x10e28c;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_2060 = (fdb_kvs_handle *)0x10e299;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_2060 = (fdb_kvs_handle *)0x10e2ca;
      fprintf(_stderr,pcVar13,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e314:
    pfStack_2060 = (fdb_kvs_handle *)0x10e319;
    fragmented_reuse_test();
LAB_0010e319:
    pfStack_2060 = (fdb_kvs_handle *)0x10e320;
    fragmented_reuse_test();
LAB_0010e320:
    pfStack_2060 = (fdb_kvs_handle *)0x10e327;
    fragmented_reuse_test();
LAB_0010e327:
    pfStack_2060 = (fdb_kvs_handle *)0x10e32c;
    fragmented_reuse_test();
LAB_0010e32c:
    pfStack_2060 = (fdb_kvs_handle *)0x10e333;
    fragmented_reuse_test();
LAB_0010e333:
    pfStack_2060 = (fdb_kvs_handle *)0x10e338;
    fragmented_reuse_test();
LAB_0010e338:
    pfStack_2060 = (fdb_kvs_handle *)0x10e33f;
    fragmented_reuse_test();
LAB_0010e33f:
    pfStack_2060 = (fdb_kvs_handle *)0x10e346;
    fragmented_reuse_test();
  }
  pfStack_2060 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_2528 = (code *)0x10e36a;
  pcStack_2088 = pcVar24;
  pfStack_2080 = pfVar10;
  pfStack_2078 = pfVar11;
  pfStack_2070 = (fdb_kvs_handle *)pcVar13;
  pfStack_2068 = (fdb_kvs_handle *)pcVar14;
  pfStack_2060 = pfVar21;
  gettimeofday(&tStack_24f0,(__timezone_ptr_t)0x0);
  pcStackY_2528 = (code *)0x10e36f;
  memleak_start();
  pfStack_2500 = (fdb_doc *)0x0;
  pcStackY_2528 = (code *)0x10e388;
  fdb_get_default_kvs_config();
  pcStackY_2528 = (code *)0x10e398;
  fdb_get_default_config();
  fStack_2180.compaction_threshold = '\0';
  fStack_2180.block_reusing_threshold = 0x23;
  fStack_2180.num_keeping_headers = 10;
  pcStackY_2528 = (code *)0x10e3bf;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_2528 = (code *)0x10e3d6;
  fdb_open(&pfStack_2510,"./staleblktest1",&fStack_2180);
  pcStackY_2528 = (code *)0x10e3ed;
  fdb_kvs_open(pfStack_2510,&pfStack_2518,"db",&fStack_22e0);
  pcStackY_2528 = (code *)0x10e404;
  fdb_kvs_open(pfStack_2510,&pfStack_24f8,"db2",&fStack_22e0);
  pcVar13 = acStack_2280;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar14 = acStack_24e0;
  pcVar24 = (char *)0x0;
  do {
    pcStackY_2528 = (code *)0x10e430;
    sprintf(pcVar13,"%dkey",pcVar24);
    pfVar21 = pfStack_2518;
    builtin_strncpy(acStack_24e0,"aaaaaaaaaaa",0xc);
    pcStackY_2528 = (code *)0x10e44f;
    sVar8 = strlen(pcVar13);
    pcStackY_2528 = (code *)0x10e45a;
    sVar6 = strlen(pcVar14);
    pcStackY_2528 = (code *)0x10e46e;
    fVar2 = fdb_set_kv(pfVar21,pcVar13,sVar8,pcVar14,sVar6);
    pfVar21 = pfStack_24f8;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStackY_2528 = (code *)0x10e779;
      enter_reuse_via_separate_kvs_test();
LAB_0010e779:
      pcStackY_2528 = (code *)0x10e780;
      enter_reuse_via_separate_kvs_test();
LAB_0010e780:
      pcStackY_2528 = (code *)0x10e787;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e787;
    }
    pcStackY_2528 = (code *)0x10e483;
    sVar8 = strlen(pcVar13);
    pcStackY_2528 = (code *)0x10e48e;
    sVar6 = strlen(pcVar14);
    pcStackY_2528 = (code *)0x10e4a2;
    fVar2 = fdb_set_kv(pfVar21,pcVar13,sVar8,pcVar14,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e779;
    pcStackY_2528 = (code *)0x10e4b9;
    fVar2 = fdb_commit(pfStack_2510,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e780;
    uVar17 = (int)pcVar24 + 1;
    pcVar24 = (char *)(ulong)uVar17;
  } while (uVar17 != 10);
  pcVar14 = (char *)0x0;
  pcVar24 = acStack_2280;
  pcVar13 = acStack_24e0;
  doc = (fdb_doc **)0x0;
  do {
    pfVar21 = pfStack_2518;
    builtin_strncpy(acStack_2280,"0key",5);
    builtin_strncpy(acStack_24e0,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_2528 = (code *)0x10e541;
    sVar8 = strlen(pcVar24);
    pcStackY_2528 = (code *)0x10e54c;
    sVar6 = strlen(pcVar13);
    pcStackY_2528 = (code *)0x10e560;
    fVar2 = fdb_set_kv(pfVar21,pcVar24,sVar8,pcVar13,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e78e;
    pcStackY_2528 = (code *)0x10e57a;
    fVar2 = fdb_get_file_info(pfStack_2510,&fStack_22c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e787;
    uVar17 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar17;
  } while (fStack_22c8.file_size < 0x1000000);
  pcStackY_2528 = (code *)0x10e5a0;
  sVar3 = sb_check_block_reusing(pfStack_2518);
  if (sVar3 == SBD_RECLAIM) {
    pcStackY_2528 = (code *)0x10e5b8;
    fVar2 = fdb_commit(pfStack_2510,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7a6;
    pcVar13 = acStack_2280;
    pcVar14 = acStack_24e0;
    pcVar24 = (char *)0x0;
    do {
      pcStackY_2528 = (code *)0x10e5e2;
      sprintf(pcVar13,"key%d",pcVar24);
      pfVar21 = pfStack_2518;
      builtin_strncpy(acStack_24e0,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_2528 = (code *)0x10e632;
      sVar8 = strlen(pcVar13);
      pcStackY_2528 = (code *)0x10e63d;
      sVar6 = strlen(pcVar14);
      pcStackY_2528 = (code *)0x10e651;
      fVar2 = fdb_set_kv(pfVar21,pcVar13,sVar8,pcVar14,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e795;
      uVar22 = (int)pcVar24 + 1;
      pcVar24 = (char *)(ulong)uVar22;
    } while (uVar17 != uVar22);
    pcStackY_2528 = (code *)0x10e672;
    fVar2 = fdb_commit(pfStack_2510,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7ad;
    pcStackY_2528 = (code *)0x10e69a;
    fdb_iterator_init(pfStack_24f8,&pfStack_2508,(void *)0x0,0,(void *)0x0,0,0);
    pcVar24 = (char *)0xa;
    doc = &pfStack_2500;
    do {
      pcStackY_2528 = (code *)0x10e6b1;
      fVar2 = fdb_iterator_get(pfStack_2508,doc);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e79c;
      pcStackY_2528 = (code *)0x10e6c3;
      fdb_doc_free(pfStack_2500);
      pfStack_2500 = (fdb_doc *)0x0;
      pcStackY_2528 = (code *)0x10e6d6;
      fVar2 = fdb_iterator_next(pfStack_2508);
      uVar17 = (int)pcVar24 - 1;
      pcVar24 = (char *)(ulong)uVar17;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar17 != 0) goto LAB_0010e7b4;
    pcStackY_2528 = (code *)0x10e6ef;
    fdb_iterator_close(pfStack_2508);
    pcStackY_2528 = (code *)0x10e6f9;
    fVar2 = fdb_kvs_close(pfStack_2518);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7b9;
    pcStackY_2528 = (code *)0x10e70b;
    fVar2 = fdb_kvs_close(pfStack_24f8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStackY_2528 = (code *)0x10e71d;
      fVar2 = fdb_close(pfStack_2510);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStackY_2528 = (code *)0x10e72a;
        fdb_shutdown();
        pcStackY_2528 = (code *)0x10e72f;
        memleak_end();
        pcVar13 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        pcStackY_2528 = (code *)0x10e760;
        fprintf(_stderr,pcVar13,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7c7;
    }
  }
  else {
LAB_0010e7a1:
    pcStackY_2528 = (code *)0x10e7a6;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7a6:
    pcStackY_2528 = (code *)0x10e7ad;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7ad:
    pcStackY_2528 = (code *)0x10e7b4;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b4:
    pcStackY_2528 = (code *)0x10e7b9;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b9:
    pcStackY_2528 = (code *)0x10e7c0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_2528 = (code *)0x10e7c7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7c7:
  pcStackY_2528 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_2550 = doc;
  sStackY_2540 = sVar8;
  pcStackY_2538 = pcVar13;
  pcStackY_2530 = pcVar14;
  pcStackY_2528 = (code *)pcVar24;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_2850.block_reusing_threshold = 0x41;
  fStackY_2850.num_keeping_headers = 5;
  fdb_open(&pfStackY_2978,"./staleblktest1",&fStackY_2850);
  fdb_kvs_open(pfStackY_2978,&pfStackY_2980,"db",&fStackY_2970);
  iVar4 = 0;
  uVar19 = 0;
  do {
    sprintf(acStackY_2958,"key%d",uVar19);
    sprintf(acStackY_2758,"seqno%d",uVar19);
    pfVar21 = pfStackY_2980;
    sVar6 = strlen(acStackY_2958);
    sVar8 = strlen(acStackY_2758);
    fdb_set_kv(pfVar21,acStackY_2958,sVar6,acStackY_2758,sVar8);
    if ((int)(uVar19 / 100) * 100 + iVar4 == 0) {
      fdb_commit(pfStackY_2978,(int)(uVar19 / 500) * 500 + iVar4 == 0);
    }
    uVar19 = (ulong)((int)uVar19 + 1);
    iVar4 = iVar4 + -1;
  } while( true );
LAB_0010c39a:
  pcStack_4a8 = (code *)0x10c3a1;
  snapshot_before_block_reuse_test();
LAB_0010c3a1:
  pcStack_4a8 = (code *)0x10c3a8;
  snapshot_before_block_reuse_test();
LAB_0010c3a8:
  pcStack_4a8 = (code *)0x10c3af;
  snapshot_before_block_reuse_test();
LAB_0010c3af:
  unaff_R15 = "val";
  pfVar23 = (fdb_config *)0x148599;
  pcStack_4a8 = (code *)0x10c3b6;
  snapshot_before_block_reuse_test();
  goto LAB_0010c3b6;
LAB_0010c6ae:
  pcStack_670 = (code *)0x10c6b5;
  snapshot_after_block_reuse_test();
LAB_0010c6b5:
  pcStack_670 = (code *)0x10c6bc;
  snapshot_after_block_reuse_test();
  goto LAB_0010c6bc;
LAB_0010ca07:
  pcStack_828 = (code *)0x10ca0e;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca0e:
  pcStack_828 = (code *)0x10ca15;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca15:
  pcStack_828 = (code *)0x10ca1c;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca1c:
  pcVar13 = "val";
  pfVar23 = (fdb_config *)0x148599;
  pcStack_828 = (code *)0x10ca23;
  snapshot_inmem_before_block_reuse_test();
  goto LAB_0010ca23;
code_r0x0010cc8c:
  unaff_RBP = unaff_RBP + 0x400;
  if (unaff_RBP == 0xfff) goto code_r0x0010cc9c;
  goto LAB_0010cc33;
code_r0x0010cc9c:
  pcStack_b10 = (code *)0x10ccab;
  fVar2 = fdb_get_file_info(pfStack_b00,&fStack_a90);
  aVar25 = aStack_af0;
  sVar20 = sStack_af8;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d08a;
  handle.seqtree = (btree *)&(aStack_af0.seqtree)->vsize;
  sVar7 = (size_t)((int)sStack_af8 + 8);
  if (0xffffff < fStack_a90.file_size) goto code_r0x0010ccd6;
  goto LAB_0010cc24;
LAB_0010d08a:
  pcStack_b10 = (code *)0x10d091;
  variable_value_size_test();
LAB_0010d091:
  pcStack_b10 = (code *)0x10d098;
  variable_value_size_test();
  aVar26 = handle;
LAB_0010d098:
  handle = aVar26;
  pcStack_b10 = (code *)0x10d09f;
  variable_value_size_test();
LAB_0010d09f:
  pcStack_b10 = (code *)0x10d0a6;
  variable_value_size_test();
  sVar20 = unaff_RBP;
  aVar25 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar24;
  goto LAB_0010d0a6;
code_r0x0010ccd6:
  pcStack_b10 = (code *)0x10ccdf;
  sVar3 = sb_check_block_reusing((fdb_kvs_handle *)aStack_b08.seqtree);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010d0ad;
  pcStack_b10 = (code *)0x10ccf4;
  fVar2 = fdb_commit(pfStack_b00,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b2;
  pcStack_b10 = (code *)0x10cd11;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_b08.seqtree,
                            (fdb_kvs_handle **)&aStack_ad8.seqtree,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b9;
  if ((fdb_kvs_handle *)aVar25.seqtree != (fdb_kvs_handle *)0x0) {
    aStack_ac8.seqtree = aVar25.seqtree;
    pcVar13 = (char *)0x0;
    aStack_ac0 = handle;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = aVar25;
      uVar17 = (int)sVar20 + 1;
      pcStack_b10 = (code *)0x10cd63;
      sprintf((char *)&fStack_a48,"%d_key",(ulong)uVar17);
      sStack_af8 = sVar20;
      aStack_af0 = aVar25;
      if ((int)uVar17 < 2) {
        uVar19 = 0;
      }
      else {
        uVar19 = sVar20 & 0xffffffff;
        pcStack_b10 = (code *)0x10cd85;
        memset(pcVar14,99,uVar19);
      }
      pcVar24 = (char *)aStack_b08;
      pcVar14[uVar19] = '\0';
      pfVar23 = &fStack_a48;
      pcStack_b10 = (code *)0x10cda1;
      sVar6 = strlen((char *)pfVar23);
      unaff_RBP = sVar6 + 1;
      pcStack_b10 = (code *)0x10cdad;
      sVar6 = strlen(pcVar14);
      pcStack_b10 = (code *)0x10cdc2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar24,pfVar23,unaff_RBP,pcVar14,sVar6 + 1);
      handle = aStack_ac0;
      aVar26 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d098;
      if ((fdb_kvs_handle *)
          (&((fdb_kvs_config *)&(aStack_ac0.seqtree)->ksize)->create_if_missing +
          ~(((ulong)aVar25.seqtree / 5 & 0xfffffffffffffffe) * 5)) == (fdb_kvs_handle *)pcVar13) {
        pcStack_b10 = (code *)0x10cdfc;
        fVar2 = fdb_commit(pfStack_b00,'\x01');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d09f;
      }
      aVar25.seqtree = (btree *)((long)&aStack_af0.seqtree[-1].aux + 7);
      pcVar13 = (char *)&((btree *)pcVar13)->vsize;
      sVar20 = (size_t)((int)sStack_af8 - 8);
    } while (aStack_ac8.seqtree != (btree *)pcVar13);
  }
  pfVar23 = &fStack_a48;
  pcStack_b10 = (code *)0x10ce31;
  fVar2 = fdb_commit(pfStack_b00,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c0;
  aVar25.seqtree = (btree *)&fStack_a48;
  pcStack_b10 = (code *)0x10ce57;
  sprintf((char *)aVar25.seqtree,"%d_key",0x200);
  pcStack_b10 = (code *)0x10ce69;
  memset(pcVar14,0x61,0x4fffff);
  pcVar13 = (char *)aStack_b08;
  pcVar14[0x4fffff] = '\0';
  pcStack_b10 = (code *)0x10ce7c;
  sVar6 = strlen((char *)aVar25.seqtree);
  pfVar23 = (fdb_config *)(sVar6 + 1);
  pcStack_b10 = (code *)0x10ce88;
  sVar6 = strlen(pcVar14);
  pcStack_b10 = (code *)0x10ce9d;
  fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar13,aVar25.seqtree,(size_t)pfVar23,pcVar14,sVar6 + 1);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c7;
  pcStack_b10 = (code *)0x10ceb4;
  fVar2 = fdb_commit(pfStack_b00,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ce;
  pcStack_b10 = (code *)0x10ceda;
  sprintf((char *)&fStack_a48,"%d_key",0x200);
  pcStack_b10 = (code *)0x10ceec;
  memset(pcVar14,0x61,0x1ff);
  pcVar13 = (char *)aStack_ad0;
  pcVar14[0x1ff] = '\0';
  pcStack_b10 = (code *)0x10cf00;
  sVar6 = strlen((char *)&fStack_a48);
  pcStack_b10 = (code *)0x10cf19;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar13,(btree *)&fStack_a48,sVar6 + 1,&aStack_ae0.seqtree,
                     (size_t *)&pkStack_ae8);
  aVar26 = aStack_ae0;
  aVar25.seqtree = (btree *)&fStack_a48;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0d5;
  pcStack_b10 = (code *)0x10cf36;
  iVar4 = bcmp(pcVar14,aStack_ae0.seqtree,(size_t)pkStack_ae8);
  if (iVar4 != 0) goto LAB_0010d0dc;
  pcStack_b10 = (code *)0x10cf46;
  fVar2 = fdb_free_block(aVar26.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e4;
  aVar26.seqtree = (btree *)&fStack_a48;
  pcStack_b10 = (code *)0x10cf6c;
  sprintf((char *)aVar26.seqtree,"%d_key",0x800);
  pcStack_b10 = (code *)0x10cf7e;
  memset(pcVar14,0x62,0x7ff);
  pcVar13 = (char *)aStack_ad8;
  pcVar14[0x7ff] = '\0';
  pcStack_b10 = (code *)0x10cf92;
  sVar6 = strlen((char *)aVar26.seqtree);
  pcStack_b10 = (code *)0x10cfab;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar13,aVar26.seqtree,sVar6 + 1,&aStack_ae0.seqtree,
                     (size_t *)&pkStack_ae8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0eb;
  pcStack_b10 = (code *)0x10cfc8;
  iVar4 = bcmp(pcVar14,aStack_ae0.seqtree,(size_t)pkStack_ae8);
  aVar26 = aStack_ae0;
  if (iVar4 != 0) goto LAB_0010d0f2;
  pcStack_b10 = (code *)0x10cfd8;
  fVar2 = fdb_free_block(aStack_ae0.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0fa;
  pcStack_b10 = (code *)0x10cfe8;
  operator_delete__(pcVar14);
  pcStack_b10 = (code *)0x10cff1;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_b08.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d101;
  pcStack_b10 = (code *)0x10d003;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_ad0.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d108;
  pcStack_b10 = (code *)0x10d015;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_ad8.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d10f;
  pcStack_b10 = (code *)0x10d027;
  fVar2 = fdb_close(pfStack_b00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_b10 = (code *)0x10d034;
    fdb_shutdown();
    pcStack_b10 = (code *)0x10d039;
    memleak_end();
    pcVar13 = "%s PASSED\n";
    if (variable_value_size_test()::__test_pass != '\0') {
      pcVar13 = "%s FAILED\n";
    }
    pcStack_b10 = (code *)0x10d06a;
    fprintf(_stderr,pcVar13,"variable value size test");
    return;
  }
  goto LAB_0010d116;
LAB_0010d46c:
  pcStack_11e8 = (code *)0x10d473;
  rollback_with_num_keeping_headers();
LAB_0010d473:
  pcStack_11e8 = (code *)0x10d47a;
  rollback_with_num_keeping_headers();
LAB_0010d47a:
  pcStack_11e8 = (code *)0x10d481;
  rollback_with_num_keeping_headers();
  goto LAB_0010d481;
LAB_0010da0f:
  pcStack_16d0 = (code *)0x10da16;
  crash_and_recover_with_num_keeping_test();
LAB_0010da16:
  pcStack_16d0 = (code *)0x10da1d;
  crash_and_recover_with_num_keeping_test();
LAB_0010da1d:
  pcStack_16d0 = (code *)0x10da24;
  crash_and_recover_with_num_keeping_test();
LAB_0010da24:
  pcStack_16d0 = (code *)0x10da2b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da2b:
  pcStack_16d0 = (code *)0x10da32;
  crash_and_recover_with_num_keeping_test();
LAB_0010da32:
  pcStack_16d0 = (code *)0x10da39;
  crash_and_recover_with_num_keeping_test();
LAB_0010da39:
  pcStack_16d0 = (code *)0x10da40;
  crash_and_recover_with_num_keeping_test();
  goto LAB_0010da40;
LAB_0010de40:
  pfStack_1b78 = (fdb_kvs_handle *)0x10de47;
  reuse_on_delete_test();
LAB_0010de47:
  pfVar9 = pfVar10;
  pfStack_1b78 = (fdb_kvs_handle *)0x10de4e;
  reuse_on_delete_test();
LAB_0010de4e:
  pfStack_1b78 = (fdb_kvs_handle *)0x10de55;
  reuse_on_delete_test();
LAB_0010de55:
  pfStack_1b78 = (fdb_kvs_handle *)0x10de5c;
  reuse_on_delete_test();
  pfVar10 = pfVar9;
  goto LAB_0010de5c;
LAB_0010e2ea:
  pfStack_2060 = (fdb_kvs_handle *)0x10e2f1;
  fragmented_reuse_test();
LAB_0010e2f1:
  pfStack_2060 = (fdb_kvs_handle *)0x10e2f8;
  fragmented_reuse_test();
LAB_0010e2f8:
  pfStack_2060 = (fdb_kvs_handle *)0x10e2ff;
  fragmented_reuse_test();
LAB_0010e2ff:
  pfStack_2060 = (fdb_kvs_handle *)0x10e306;
  fragmented_reuse_test();
LAB_0010e306:
  pfStack_2060 = (fdb_kvs_handle *)0x10e30d;
  fragmented_reuse_test();
LAB_0010e30d:
  pfStack_2060 = (fdb_kvs_handle *)0x10e314;
  fragmented_reuse_test();
  goto LAB_0010e314;
LAB_0010e787:
  pcStackY_2528 = (code *)0x10e78e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e78e:
  pcStackY_2528 = (code *)0x10e795;
  enter_reuse_via_separate_kvs_test();
LAB_0010e795:
  pcStackY_2528 = (code *)0x10e79c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e79c:
  pcStackY_2528 = (code *)0x10e7a1;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e7a1;
}

Assistant:

void verify_high_num_keeping_headers_param_test() {
    memleak_start();
    TEST_INIT();

    int i, r;
    int low_seq = 0;
    int nheaders=100;
    char keybuf[16];
    void *rvalue;
    size_t rvalue_len;

    fdb_file_handle* dbfile;
    fdb_kvs_handle* db;
    fdb_kvs_handle* snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;
    fconfig.num_keeping_headers = nheaders;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "num_keep", &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "val";

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // create lowest commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    low_seq = i;

    // create 100 headers
    for (i = 0; i < nheaders; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // make sure all blocks up to kept headers are reused
    i = low_seq;
    while (--i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // -101 commit fail
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    // -100 commit pass
    low_seq++;
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_STATUS(status);

    status = fdb_get_kv(db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_STATUS(status);

    // cleanup
    status = fdb_free_block(rvalue);
    TEST_STATUS(status);
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    memleak_end();
    TEST_RESULT("verify high num keeping headers param test");
}